

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse2::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse2::SubdivPatch1IntersectorK<4>,_true>::
     intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
               RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  float *pfVar6;
  int iVar7;
  Geometry *pGVar8;
  size_t sVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [12];
  long lVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar17;
  RTCRayN *pRVar18;
  ulong uVar19;
  RTCFilterFunctionN p_Var20;
  int iVar21;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar22;
  ulong uVar23;
  char *pcVar24;
  long lVar25;
  GridSOA *pGVar26;
  undefined4 uVar27;
  ulong uVar28;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar53;
  undefined1 auVar54 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar55;
  float fVar56;
  float fVar57;
  float fVar76;
  float fVar77;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar78;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar97;
  float fVar110;
  float fVar111;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar112;
  undefined1 auVar102 [16];
  float fVar113;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar114;
  float fVar123;
  float fVar124;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar125;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar134;
  float fVar141;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar153 [16];
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar176;
  float fVar177;
  float fVar178;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar186;
  float fVar187;
  float fVar189;
  undefined1 auVar184 [16];
  float fVar188;
  undefined1 auVar185 [16];
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  undefined1 auVar203 [16];
  undefined8 uStack_12c0;
  undefined8 uStack_12b0;
  undefined8 local_1298;
  undefined4 uStack_127c;
  undefined8 local_1268;
  undefined8 local_1258;
  vbool<4> valid;
  undefined1 local_1238 [16];
  Precalculations *local_1228;
  char *local_1220;
  ulong local_1218;
  ulong local_1210;
  float local_1208;
  float fStack_1204;
  float fStack_1200;
  float fStack_11fc;
  undefined8 local_11f8;
  float fStack_11f0;
  float fStack_11ec;
  RTCFilterFunctionNArguments args;
  undefined4 uStack_11ac;
  vfloat<4> tNear;
  float local_1148 [4];
  float local_1138 [4];
  float local_1128 [4];
  undefined1 local_1118 [8];
  float fStack_1110;
  float fStack_110c;
  float local_1108 [4];
  float local_10f8 [4];
  undefined1 local_10e8 [16];
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  undefined1 local_1098 [16];
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  undefined1 local_1068 [16];
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  uint local_1038;
  uint uStack_1034;
  uint uStack_1030;
  uint uStack_102c;
  uint local_1028;
  uint uStack_1024;
  uint uStack_1020;
  uint uStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  undefined1 local_f98 [16];
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 auVar152 [16];
  
  pSVar29 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  local_fb8 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_fc8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_fd8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_fe8 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_ff8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_1008 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_10b8 = local_fe8 * 0.99999964;
  local_10c8 = local_ff8 * 0.99999964;
  local_1018 = local_1008 * 0.99999964;
  local_fe8 = local_fe8 * 1.0000004;
  local_ff8 = local_ff8 * 1.0000004;
  local_1008 = local_1008 * 1.0000004;
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar28 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar21 = (tray->tnear).field_0.i[k];
  local_10e8._4_4_ = iVar21;
  local_10e8._0_4_ = iVar21;
  local_10e8._8_4_ = iVar21;
  local_10e8._12_4_ = iVar21;
  iVar21 = (tray->tfar).field_0.i[k];
  auVar172._4_4_ = iVar21;
  auVar172._0_4_ = iVar21;
  auVar172._8_4_ = iVar21;
  auVar172._12_4_ = iVar21;
  lVar16 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
  fStack_fe4 = local_fe8;
  fStack_fe0 = local_fe8;
  fStack_fdc = local_fe8;
  fStack_ff4 = local_ff8;
  fStack_ff0 = local_ff8;
  fStack_fec = local_ff8;
  fStack_1004 = local_1008;
  fStack_1000 = local_1008;
  fStack_ffc = local_1008;
  fStack_1014 = local_1018;
  fStack_1010 = local_1018;
  fStack_100c = local_1018;
  fStack_10c4 = local_10c8;
  fStack_10c0 = local_10c8;
  fStack_10bc = local_10c8;
  fStack_fb4 = local_fb8;
  fStack_fb0 = local_fb8;
  fStack_fac = local_fb8;
  fStack_fc4 = local_fc8;
  fStack_fc0 = local_fc8;
  fStack_fbc = local_fc8;
  fStack_fd4 = local_fd8;
  fStack_fd0 = local_fd8;
  fStack_fcc = local_fd8;
  fStack_10b4 = local_10b8;
  fStack_10b0 = local_10b8;
  fStack_10ac = local_10b8;
  auVar46 = local_10e8;
  fVar154 = local_fb8;
  fVar206 = local_fb8;
  fVar157 = local_fb8;
  fVar207 = local_fb8;
  fVar110 = local_fc8;
  fVar177 = local_fc8;
  fVar112 = local_fc8;
  fVar178 = local_fc8;
  fVar144 = local_fe8;
  fVar124 = local_fe8;
  fVar148 = local_fe8;
  fVar125 = local_fe8;
  fVar113 = local_10c8;
  fVar57 = local_10c8;
  fVar56 = local_10c8;
  fVar188 = local_10c8;
  fVar76 = local_10b8;
  fVar77 = local_10b8;
  fVar78 = local_10b8;
  fVar97 = local_10b8;
  fVar111 = local_fd8;
  fVar114 = local_fd8;
  fVar123 = local_fd8;
  fVar134 = local_fd8;
  fVar141 = local_ff8;
  fVar142 = local_ff8;
  fVar143 = local_ff8;
  fVar145 = local_ff8;
  fVar146 = local_1008;
  fVar147 = local_1008;
  fVar149 = local_1008;
  fVar150 = local_1008;
  fVar151 = local_1018;
  fVar155 = local_1018;
  fVar156 = local_1018;
  fVar158 = local_1018;
  local_1228 = pre;
LAB_00661861:
  do {
    do {
      if (pSVar29 == stack) {
        return;
      }
      pSVar17 = pSVar29 + -1;
      pSVar29 = pSVar29 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar17->dist &&
             (float)pSVar17->dist != *(float *)(ray + k * 4 + 0x80));
    pSVar17 = stack;
    pSVar22 = (StackItemT<embree::NodeRefPtr<4>_> *)(pSVar29->ptr).ptr;
    while (((ulong)pSVar22 & 8) == 0) {
      pfVar6 = (float *)((long)&pSVar22[2].ptr.ptr + uVar31);
      auVar58._0_4_ = (*pfVar6 - fVar154) * fVar76;
      auVar58._4_4_ = (pfVar6[1] - fVar206) * fVar77;
      auVar58._8_4_ = (pfVar6[2] - fVar157) * fVar78;
      auVar58._12_4_ = (pfVar6[3] - fVar207) * fVar97;
      pfVar6 = (float *)((long)&pSVar22[2].ptr.ptr + uVar28);
      auVar118._0_4_ = (*pfVar6 - fVar110) * fVar113;
      auVar118._4_4_ = (pfVar6[1] - fVar177) * fVar57;
      auVar118._8_4_ = (pfVar6[2] - fVar112) * fVar56;
      auVar118._12_4_ = (pfVar6[3] - fVar178) * fVar188;
      auVar58 = maxps(auVar58,auVar118);
      pfVar6 = (float *)((long)&pSVar22[2].ptr.ptr + uVar32);
      auVar127._0_4_ = (*pfVar6 - fVar111) * fVar151;
      auVar127._4_4_ = (pfVar6[1] - fVar114) * fVar155;
      auVar127._8_4_ = (pfVar6[2] - fVar123) * fVar156;
      auVar127._12_4_ = (pfVar6[3] - fVar134) * fVar158;
      auVar79 = maxps(auVar127,auVar46);
      tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar58,auVar79);
      pfVar6 = (float *)((long)&pSVar22[2].ptr.ptr + (uVar31 ^ 0x10));
      auVar136._0_4_ = (*pfVar6 - fVar154) * fVar144;
      auVar136._4_4_ = (pfVar6[1] - fVar206) * fVar124;
      auVar136._8_4_ = (pfVar6[2] - fVar157) * fVar148;
      auVar136._12_4_ = (pfVar6[3] - fVar207) * fVar125;
      pfVar6 = (float *)((long)&pSVar22[2].ptr.ptr + (uVar28 ^ 0x10));
      auVar98._0_4_ = (*pfVar6 - fVar110) * fVar141;
      auVar98._4_4_ = (pfVar6[1] - fVar177) * fVar142;
      auVar98._8_4_ = (pfVar6[2] - fVar112) * fVar143;
      auVar98._12_4_ = (pfVar6[3] - fVar178) * fVar145;
      auVar58 = minps(auVar136,auVar98);
      pfVar6 = (float *)((long)&pSVar22[2].ptr.ptr + (uVar32 ^ 0x10));
      auVar99._0_4_ = (*pfVar6 - fVar111) * fVar146;
      auVar99._4_4_ = (pfVar6[1] - fVar114) * fVar147;
      auVar99._8_4_ = (pfVar6[2] - fVar123) * fVar149;
      auVar99._12_4_ = (pfVar6[3] - fVar134) * fVar150;
      auVar79 = minps(auVar99,auVar172);
      auVar58 = minps(auVar58,auVar79);
      auVar79._4_4_ = -(uint)(tNear.field_0._4_4_ <= auVar58._4_4_);
      auVar79._0_4_ = -(uint)(tNear.field_0._0_4_ <= auVar58._0_4_);
      auVar79._8_4_ = -(uint)(tNear.field_0._8_4_ <= auVar58._8_4_);
      auVar79._12_4_ = -(uint)(tNear.field_0._12_4_ <= auVar58._12_4_);
      uVar15 = movmskps((int)pSVar17,auVar79);
      if (uVar15 == 0) goto LAB_00661861;
      uVar15 = uVar15 & 0xff;
      uVar23 = (ulong)pSVar22 & 0xfffffffffffffff0;
      lVar30 = 0;
      if (uVar15 != 0) {
        for (; (uVar15 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
        }
      }
      pSVar17 = *(StackItemT<embree::NodeRefPtr<4>_> **)(uVar23 + lVar30 * 8);
      uVar15 = uVar15 - 1 & uVar15;
      pSVar22 = pSVar17;
      if (uVar15 != 0) {
        uVar33 = tNear.field_0.i[lVar30];
        lVar30 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
          }
        }
        pSVar22 = *(StackItemT<embree::NodeRefPtr<4>_> **)(uVar23 + lVar30 * 8);
        uVar34 = tNear.field_0.i[lVar30];
        uVar15 = uVar15 - 1 & uVar15;
        if (uVar15 == 0) {
          if (uVar33 < uVar34) {
            (pSVar29->ptr).ptr = (size_t)pSVar22;
            pSVar29->dist = uVar34;
            pSVar22 = pSVar17;
            pSVar29 = pSVar29 + 1;
          }
          else {
            (pSVar29->ptr).ptr = (size_t)pSVar17;
            pSVar29->dist = uVar33;
            pSVar17 = pSVar22;
            pSVar29 = pSVar29 + 1;
          }
        }
        else {
          auVar59._8_4_ = uVar33;
          auVar59._0_8_ = pSVar17;
          auVar59._12_4_ = 0;
          auVar80._8_4_ = uVar34;
          auVar80._0_8_ = pSVar22;
          auVar80._12_4_ = 0;
          lVar30 = 0;
          if (uVar15 != 0) {
            for (; (uVar15 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
            }
          }
          uVar19 = *(ulong *)(uVar23 + lVar30 * 8);
          iVar21 = tNear.field_0.i[lVar30];
          auVar100._8_4_ = iVar21;
          auVar100._0_8_ = uVar19;
          auVar100._12_4_ = 0;
          auVar115._8_4_ = -(uint)((int)uVar33 < (int)uVar34);
          uVar15 = uVar15 - 1 & uVar15;
          auVar46 = local_10e8;
          if (uVar15 == 0) {
            auVar115._4_4_ = auVar115._8_4_;
            auVar115._0_4_ = auVar115._8_4_;
            auVar115._12_4_ = auVar115._8_4_;
            auVar58 = auVar59 & auVar115 | ~auVar115 & auVar80;
            auVar79 = auVar80 & auVar115 | ~auVar115 & auVar59;
            auVar116._8_4_ = -(uint)(auVar58._8_4_ < iVar21);
            auVar116._0_8_ = CONCAT44(auVar116._8_4_,auVar116._8_4_);
            auVar116._12_4_ = auVar116._8_4_;
            pSVar17 = (StackItemT<embree::NodeRefPtr<4>_> *)
                      (~auVar116._0_8_ & uVar19 | auVar58._0_8_ & auVar116._0_8_);
            auVar58 = auVar100 & auVar116 | ~auVar116 & auVar58;
            auVar60._8_4_ = -(uint)(auVar79._8_4_ < auVar58._8_4_);
            auVar60._4_4_ = auVar60._8_4_;
            auVar60._0_4_ = auVar60._8_4_;
            auVar60._12_4_ = auVar60._8_4_;
            *pSVar29 = (StackItemT<embree::NodeRefPtr<4>_>)(~auVar60 & auVar79 | auVar58 & auVar60);
            pSVar29[1] = (StackItemT<embree::NodeRefPtr<4>_>)
                         (auVar79 & auVar60 | ~auVar60 & auVar58);
            pSVar22 = pSVar17;
            pSVar29 = pSVar29 + 2;
          }
          else {
            lVar30 = 0;
            if (uVar15 != 0) {
              for (; (uVar15 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
              }
            }
            iVar7 = tNear.field_0.i[lVar30];
            auVar126._8_4_ = iVar7;
            auVar126._0_8_ = *(undefined8 *)(uVar23 + lVar30 * 8);
            auVar126._12_4_ = 0;
            auVar117._4_4_ = auVar115._8_4_;
            auVar117._0_4_ = auVar115._8_4_;
            auVar117._8_4_ = auVar115._8_4_;
            auVar117._12_4_ = auVar115._8_4_;
            auVar58 = auVar59 & auVar117 | ~auVar117 & auVar80;
            auVar79 = auVar80 & auVar117 | ~auVar117 & auVar59;
            auVar135._0_4_ = -(uint)(iVar21 < iVar7);
            auVar135._4_4_ = -(uint)(iVar21 < iVar7);
            auVar135._8_4_ = -(uint)(iVar21 < iVar7);
            auVar135._12_4_ = -(uint)(iVar21 < iVar7);
            auVar118 = auVar100 & auVar135 | ~auVar135 & auVar126;
            auVar136 = ~auVar135 & auVar100 | auVar126 & auVar135;
            auVar101._8_4_ = -(uint)(auVar79._8_4_ < auVar136._8_4_);
            auVar101._4_4_ = auVar101._8_4_;
            auVar101._0_4_ = auVar101._8_4_;
            auVar101._12_4_ = auVar101._8_4_;
            auVar127 = auVar79 & auVar101 | ~auVar101 & auVar136;
            auVar81._8_4_ = -(uint)(auVar58._8_4_ < auVar118._8_4_);
            auVar81._0_8_ = CONCAT44(auVar81._8_4_,auVar81._8_4_);
            auVar81._12_4_ = auVar81._8_4_;
            pSVar17 = (StackItemT<embree::NodeRefPtr<4>_> *)
                      (auVar58._0_8_ & auVar81._0_8_ | ~auVar81._0_8_ & auVar118._0_8_);
            auVar58 = ~auVar81 & auVar58 | auVar118 & auVar81;
            auVar61._8_4_ = -(uint)(auVar58._8_4_ < auVar127._8_4_);
            auVar61._4_4_ = auVar61._8_4_;
            auVar61._0_4_ = auVar61._8_4_;
            auVar61._12_4_ = auVar61._8_4_;
            *pSVar29 = (StackItemT<embree::NodeRefPtr<4>_>)
                       (~auVar101 & auVar79 | auVar136 & auVar101);
            pSVar29[1] = (StackItemT<embree::NodeRefPtr<4>_>)
                         (~auVar61 & auVar58 | auVar127 & auVar61);
            pSVar29[2] = (StackItemT<embree::NodeRefPtr<4>_>)
                         (auVar58 & auVar61 | ~auVar61 & auVar127);
            pSVar22 = pSVar17;
            pSVar29 = pSVar29 + 3;
            fVar113 = local_10c8;
            fVar57 = fStack_10c4;
            fVar56 = fStack_10c0;
            fVar188 = fStack_10bc;
            fVar76 = local_10b8;
            fVar77 = fStack_10b4;
            fVar78 = fStack_10b0;
            fVar97 = fStack_10ac;
          }
        }
      }
    }
    if (((uint)pSVar22 & 0xf) == 8) {
      pGVar26 = (local_1228->super_Precalculations).grid;
      uVar23 = (ulong)pGVar26->width;
      lVar30 = ((ulong)pSVar22 >> 4) * 4 + (ulong)pGVar26->gridOffset;
      pcVar3 = pGVar26->data + ((ulong)pSVar22 >> 4) * 4 + (ulong)pGVar26->gridOffset + -4;
      fVar154 = *(float *)(pcVar3 + 4);
      pcVar24 = pGVar26->data + uVar23 * 4 + lVar30 + -4;
      fVar206 = *(float *)(pcVar24 + 4);
      fVar157 = *(float *)(pcVar3 + 8);
      fVar207 = *(float *)(pcVar24 + 8);
      if (uVar23 == 2) {
        fVar157 = fVar154;
        fVar207 = fVar206;
      }
      uVar19 = (ulong)pGVar26->dim_offset;
      lVar25 = uVar19 * 4 + lVar30;
      fVar110 = *(float *)(pGVar26->data + lVar25);
      pcVar1 = pGVar26->data + lVar25 + -4 + uVar23 * 4;
      fVar177 = *(float *)(pcVar1 + 4);
      fVar112 = *(float *)(pGVar26->data + lVar25 + 4);
      fVar178 = *(float *)(pcVar1 + 8);
      if (uVar23 == 2) {
        fVar112 = fVar110;
        fVar178 = fVar177;
      }
      lVar13 = uVar19 * 8 + lVar30;
      fVar144 = *(float *)(pGVar26->data + lVar13);
      pcVar2 = pGVar26->data + lVar13 + -4 + uVar23 * 4;
      fVar124 = *(float *)(pcVar2 + 4);
      fVar148 = *(float *)(pGVar26->data + lVar13 + 4);
      fVar125 = *(float *)(pcVar2 + 8);
      if (uVar23 == 2) {
        fVar148 = fVar144;
        fVar125 = fVar124;
      }
      uVar15 = pGVar26->height;
      lVar14 = uVar19 * 0xc + lVar30;
      local_1220 = pGVar26->data + lVar14 + -4;
      fVar113 = *(float *)(ray + k * 4);
      fVar57 = *(float *)(ray + k * 4 + 0x10);
      fVar56 = *(float *)(ray + k * 4 + 0x20);
      fVar188 = *(float *)(ray + k * 4 + 0x40);
      fVar190 = *(float *)pcVar3 - fVar113;
      fVar192 = *(float *)pcVar24 - fVar113;
      fVar195 = fVar154 - fVar113;
      fVar198 = fVar206 - fVar113;
      fVar134 = *(float *)(pGVar26->data + lVar25 + -4) - fVar57;
      fVar141 = *(float *)pcVar1 - fVar57;
      fStack_11f0 = fVar110 - fVar57;
      fStack_11ec = fVar177 - fVar57;
      fVar179 = *(float *)(pGVar26->data + lVar13 + -4) - fVar56;
      fVar180 = *(float *)pcVar2 - fVar56;
      fVar181 = fVar144 - fVar56;
      fVar182 = fVar124 - fVar56;
      fVar150 = fVar154 - fVar113;
      fVar154 = fVar154 - fVar113;
      fVar156 = fVar157 - fVar113;
      fVar157 = fVar157 - fVar113;
      fVar97 = fVar110 - fVar57;
      fVar110 = fVar110 - fVar57;
      fVar111 = fVar112 - fVar57;
      fVar112 = fVar112 - fVar57;
      fVar142 = fVar144 - fVar56;
      fVar144 = fVar144 - fVar56;
      fVar146 = fVar148 - fVar56;
      fVar148 = fVar148 - fVar56;
      fVar201 = *(float *)pcVar24 - fVar113;
      fVar204 = fVar206 - fVar113;
      fVar206 = fVar206 - fVar113;
      fVar207 = fVar207 - fVar113;
      fVar170 = *(float *)pcVar1 - fVar57;
      fVar176 = fVar177 - fVar57;
      fVar177 = fVar177 - fVar57;
      fVar178 = fVar178 - fVar57;
      fVar114 = *(float *)pcVar2 - fVar56;
      fVar123 = fVar124 - fVar56;
      fVar124 = fVar124 - fVar56;
      fVar125 = fVar125 - fVar56;
      fVar158 = fVar201 - fVar190;
      fVar160 = fVar204 - fVar192;
      fVar162 = fVar206 - fVar195;
      fVar164 = fVar207 - fVar198;
      fVar183 = fVar170 - fVar134;
      fVar186 = fVar176 - fVar141;
      fVar187 = fVar177 - fStack_11f0;
      fVar189 = fVar178 - fStack_11ec;
      fVar143 = fVar114 - fVar179;
      fVar145 = fVar123 - fVar180;
      fVar147 = fVar124 - fVar181;
      fVar149 = fVar125 - fVar182;
      fVar113 = *(float *)(ray + k * 4 + 0x50);
      fVar57 = *(float *)(ray + k * 4 + 0x60);
      auVar46._4_4_ = fVar57;
      auVar46._0_4_ = fVar57;
      fVar159 = fVar190 - fVar150;
      fVar161 = fVar192 - fVar154;
      fVar163 = fVar195 - fVar156;
      fVar165 = fVar198 - fVar157;
      fVar151 = (fVar183 * (fVar114 + fVar179) - (fVar170 + fVar134) * fVar143) * fVar188 +
                ((fVar201 + fVar190) * fVar143 - (fVar114 + fVar179) * fVar158) * fVar113 +
                (fVar158 * (fVar170 + fVar134) - (fVar201 + fVar190) * fVar183) * fVar57;
      fVar155 = (fVar186 * (fVar123 + fVar180) - (fVar176 + fVar141) * fVar145) * fVar188 +
                ((fVar204 + fVar192) * fVar145 - (fVar123 + fVar180) * fVar160) * fVar113 +
                (fVar160 * (fVar176 + fVar141) - (fVar204 + fVar192) * fVar186) * fVar57;
      auVar152._0_8_ = CONCAT44(fVar155,fVar151);
      auVar152._8_4_ =
           (fVar187 * (fVar124 + fVar181) - (fVar177 + fStack_11f0) * fVar147) * fVar188 +
           ((fVar206 + fVar195) * fVar147 - (fVar124 + fVar181) * fVar162) * fVar113 +
           (fVar162 * (fVar177 + fStack_11f0) - (fVar206 + fVar195) * fVar187) * fVar57;
      auVar152._12_4_ =
           (fVar189 * (fVar125 + fVar182) - (fVar178 + fStack_11ec) * fVar149) * fVar188 +
           ((fVar207 + fVar198) * fVar149 - (fVar125 + fVar182) * fVar164) * fVar113 +
           (fVar164 * (fVar178 + fStack_11ec) - (fVar207 + fVar198) * fVar189) * fVar57;
      fVar166 = fVar134 - fVar97;
      fVar167 = fVar141 - fVar110;
      fVar168 = fStack_11f0 - fVar111;
      fVar169 = fStack_11ec - fVar112;
      local_f88 = fVar179 - fVar142;
      fStack_f84 = fVar180 - fVar144;
      fStack_f80 = fVar181 - fVar146;
      fStack_f7c = fVar182 - fVar148;
      auVar102._0_4_ =
           (fVar166 * (fVar179 + fVar142) - (fVar134 + fVar97) * local_f88) * fVar188 +
           ((fVar190 + fVar150) * local_f88 - (fVar179 + fVar142) * fVar159) * fVar113 +
           (fVar159 * (fVar134 + fVar97) - (fVar190 + fVar150) * fVar166) * fVar57;
      auVar102._4_4_ =
           (fVar167 * (fVar180 + fVar144) - (fVar141 + fVar110) * fStack_f84) * fVar188 +
           ((fVar192 + fVar154) * fStack_f84 - (fVar180 + fVar144) * fVar161) * fVar113 +
           (fVar161 * (fVar141 + fVar110) - (fVar192 + fVar154) * fVar167) * fVar57;
      auVar102._8_4_ =
           (fVar168 * (fVar181 + fVar146) - (fStack_11f0 + fVar111) * fStack_f80) * fVar188 +
           ((fVar195 + fVar156) * fStack_f80 - (fVar181 + fVar146) * fVar163) * fVar113 +
           (fVar163 * (fStack_11f0 + fVar111) - (fVar195 + fVar156) * fVar168) * fVar57;
      auVar102._12_4_ =
           (fVar169 * (fVar182 + fVar148) - (fStack_11ec + fVar112) * fStack_f7c) * fVar188 +
           ((fVar198 + fVar157) * fStack_f7c - (fVar182 + fVar148) * fVar165) * fVar113 +
           (fVar165 * (fStack_11ec + fVar112) - (fVar198 + fVar157) * fVar169) * fVar57;
      fVar56 = fVar150 - fVar201;
      fVar76 = fVar154 - fVar204;
      fVar77 = fVar156 - fVar206;
      fVar78 = fVar157 - fVar207;
      local_10d8 = fVar97 - fVar170;
      fStack_10d4 = fVar110 - fVar176;
      fStack_10d0 = fVar111 - fVar177;
      fStack_10cc = fVar112 - fVar178;
      fVar191 = fVar142 - fVar114;
      fVar193 = fVar144 - fVar123;
      fVar196 = fVar146 - fVar124;
      fVar199 = fVar148 - fVar125;
      auVar137._0_4_ =
           (local_10d8 * (fVar114 + fVar142) - (fVar170 + fVar97) * fVar191) * fVar188 +
           ((fVar201 + fVar150) * fVar191 - (fVar114 + fVar142) * fVar56) * fVar113 +
           (fVar56 * (fVar170 + fVar97) - (fVar201 + fVar150) * local_10d8) * fVar57;
      auVar137._4_4_ =
           (fStack_10d4 * (fVar123 + fVar144) - (fVar176 + fVar110) * fVar193) * fVar188 +
           ((fVar204 + fVar154) * fVar193 - (fVar123 + fVar144) * fVar76) * fVar113 +
           (fVar76 * (fVar176 + fVar110) - (fVar204 + fVar154) * fStack_10d4) * fVar57;
      auVar137._8_4_ =
           (fStack_10d0 * (fVar124 + fVar146) - (fVar177 + fVar111) * fVar196) * fVar188 +
           ((fVar206 + fVar156) * fVar196 - (fVar124 + fVar146) * fVar77) * fVar113 +
           (fVar77 * (fVar177 + fVar111) - (fVar206 + fVar156) * fStack_10d0) * fVar57;
      auVar137._12_4_ =
           (fStack_10cc * (fVar125 + fVar148) - (fVar178 + fVar112) * fVar199) * fVar188 +
           ((fVar207 + fVar157) * fVar199 - (fVar125 + fVar148) * fVar78) * fVar113 +
           (fVar78 * (fVar178 + fVar112) - (fVar207 + fVar157) * fStack_10cc) * fVar57;
      fVar154 = fVar151 + auVar102._0_4_ + auVar137._0_4_;
      fVar206 = fVar155 + auVar102._4_4_ + auVar137._4_4_;
      fVar157 = auVar152._8_4_ + auVar102._8_4_ + auVar137._8_4_;
      fVar207 = auVar152._12_4_ + auVar102._12_4_ + auVar137._12_4_;
      auVar171._8_4_ = auVar152._8_4_;
      auVar171._0_8_ = auVar152._0_8_;
      auVar171._12_4_ = auVar152._12_4_;
      auVar172 = minps(auVar171,auVar102);
      auVar58 = minps(auVar172,auVar137);
      auVar128._8_4_ = auVar152._8_4_;
      auVar128._0_8_ = auVar152._0_8_;
      auVar128._12_4_ = auVar152._12_4_;
      auVar172 = maxps(auVar128,auVar102);
      auVar172 = maxps(auVar172,auVar137);
      local_fa8 = ABS(fVar154);
      fStack_fa4 = ABS(fVar206);
      fStack_fa0 = ABS(fVar157);
      fStack_f9c = ABS(fVar207);
      auVar129._4_4_ = -(uint)(auVar172._4_4_ <= fStack_fa4 * 1.1920929e-07);
      auVar129._0_4_ = -(uint)(auVar172._0_4_ <= local_fa8 * 1.1920929e-07);
      auVar129._8_4_ = -(uint)(auVar172._8_4_ <= fStack_fa0 * 1.1920929e-07);
      auVar129._12_4_ = -(uint)(auVar172._12_4_ <= fStack_f9c * 1.1920929e-07);
      auVar173._4_4_ = -(uint)(-(fStack_fa4 * 1.1920929e-07) <= auVar58._4_4_);
      auVar173._0_4_ = -(uint)(-(local_fa8 * 1.1920929e-07) <= auVar58._0_4_);
      auVar173._8_4_ = -(uint)(-(fStack_fa0 * 1.1920929e-07) <= auVar58._8_4_);
      auVar173._12_4_ = -(uint)(-(fStack_f9c * 1.1920929e-07) <= auVar58._12_4_);
      auVar129 = auVar129 | auVar173;
      iVar21 = movmskps((int)local_1220,auVar129);
      if (iVar21 != 0) {
        auVar46._8_4_ = fVar57;
        auVar46._12_4_ = fVar57;
        local_f98 = auVar46;
        uVar33 = -(uint)(ABS(local_10d8 * local_f88) <= ABS(fVar166 * fVar143));
        uVar36 = -(uint)(ABS(fStack_10d4 * fStack_f84) <= ABS(fVar167 * fVar145));
        uVar39 = -(uint)(ABS(fStack_10d0 * fStack_f80) <= ABS(fVar168 * fVar147));
        uVar42 = -(uint)(ABS(fStack_10cc * fStack_f7c) <= ABS(fVar169 * fVar149));
        uVar34 = -(uint)(ABS(fVar159 * fVar191) <= ABS(fVar158 * local_f88));
        uVar37 = -(uint)(ABS(fVar161 * fVar193) <= ABS(fVar160 * fStack_f84));
        uVar40 = -(uint)(ABS(fVar163 * fVar196) <= ABS(fVar162 * fStack_f80));
        uVar43 = -(uint)(ABS(fVar165 * fVar199) <= ABS(fVar164 * fStack_f7c));
        uVar35 = -(uint)(ABS(fVar56 * fVar166) <= ABS(fVar159 * fVar183));
        uVar38 = -(uint)(ABS(fVar76 * fVar167) <= ABS(fVar161 * fVar186));
        uVar41 = -(uint)(ABS(fVar77 * fVar168) <= ABS(fVar163 * fVar187));
        uVar44 = -(uint)(ABS(fVar78 * fVar169) <= ABS(fVar165 * fVar189));
        auVar10._4_4_ = fVar206;
        auVar10._0_4_ = fVar154;
        auVar10._8_4_ = fVar157;
        auVar10._12_4_ = fVar207;
        local_1118._0_4_ =
             ~uVar33 & (uint)(fVar183 * local_f88 - fVar166 * fVar143) |
             (uint)(fVar166 * fVar191 - local_10d8 * local_f88) & uVar33;
        local_1118._4_4_ =
             ~uVar36 & (uint)(fVar186 * fStack_f84 - fVar167 * fVar145) |
             (uint)(fVar167 * fVar193 - fStack_10d4 * fStack_f84) & uVar36;
        fStack_1110 = (float)(~uVar39 & (uint)(fVar187 * fStack_f80 - fVar168 * fVar147) |
                             (uint)(fVar168 * fVar196 - fStack_10d0 * fStack_f80) & uVar39);
        fStack_110c = (float)(~uVar42 & (uint)(fVar189 * fStack_f7c - fVar169 * fVar149) |
                             (uint)(fVar169 * fVar199 - fStack_10cc * fStack_f7c) & uVar42);
        local_1108[0] =
             (float)(~uVar34 & (uint)(fVar143 * fVar159 - fVar158 * local_f88) |
                    (uint)(fVar56 * local_f88 - fVar159 * fVar191) & uVar34);
        local_1108[1] =
             (float)(~uVar37 & (uint)(fVar145 * fVar161 - fVar160 * fStack_f84) |
                    (uint)(fVar76 * fStack_f84 - fVar161 * fVar193) & uVar37);
        local_1108[2] =
             (float)(~uVar40 & (uint)(fVar147 * fVar163 - fVar162 * fStack_f80) |
                    (uint)(fVar77 * fStack_f80 - fVar163 * fVar196) & uVar40);
        local_1108[3] =
             (float)(~uVar43 & (uint)(fVar149 * fVar165 - fVar164 * fStack_f7c) |
                    (uint)(fVar78 * fStack_f7c - fVar165 * fVar199) & uVar43);
        local_10f8[0] =
             (float)(~uVar35 & (uint)(fVar158 * fVar166 - fVar159 * fVar183) |
                    (uint)(fVar159 * local_10d8 - fVar56 * fVar166) & uVar35);
        local_10f8[1] =
             (float)(~uVar38 & (uint)(fVar160 * fVar167 - fVar161 * fVar186) |
                    (uint)(fVar161 * fStack_10d4 - fVar76 * fVar167) & uVar38);
        local_10f8[2] =
             (float)(~uVar41 & (uint)(fVar162 * fVar168 - fVar163 * fVar187) |
                    (uint)(fVar163 * fStack_10d0 - fVar77 * fVar168) & uVar41);
        local_10f8[3] =
             (float)(~uVar44 & (uint)(fVar164 * fVar169 - fVar165 * fVar189) |
                    (uint)(fVar165 * fStack_10cc - fVar78 * fVar169) & uVar44);
        fVar110 = fVar188 * (float)local_1118._0_4_ +
                  fVar113 * local_1108[0] + fVar57 * local_10f8[0];
        fVar177 = fVar188 * (float)local_1118._4_4_ +
                  fVar113 * local_1108[1] + fVar57 * local_10f8[1];
        fVar112 = fVar188 * fStack_1110 + fVar113 * local_1108[2] + fVar57 * local_10f8[2];
        fVar178 = fVar188 * fStack_110c + fVar113 * local_1108[3] + fVar57 * local_10f8[3];
        auVar119._0_4_ = fVar110 + fVar110;
        auVar119._4_4_ = fVar177 + fVar177;
        auVar119._8_4_ = fVar112 + fVar112;
        auVar119._12_4_ = fVar178 + fVar178;
        auVar45._0_4_ = fVar179 * local_10f8[0];
        auVar45._4_4_ = fVar180 * local_10f8[1];
        auVar45._8_4_ = fVar181 * local_10f8[2];
        auVar45._12_4_ = fVar182 * local_10f8[3];
        fVar112 = fVar190 * (float)local_1118._0_4_ + fVar134 * local_1108[0] + auVar45._0_4_;
        fVar178 = fVar192 * (float)local_1118._4_4_ + fVar141 * local_1108[1] + auVar45._4_4_;
        fVar148 = fVar195 * fStack_1110 + fStack_11f0 * local_1108[2] + auVar45._8_4_;
        fVar125 = fVar198 * fStack_110c + fStack_11ec * local_1108[3] + auVar45._12_4_;
        auVar46 = rcpps(auVar45,auVar119);
        fVar110 = auVar46._0_4_;
        fVar177 = auVar46._4_4_;
        fVar144 = auVar46._8_4_;
        fVar124 = auVar46._12_4_;
        fVar112 = ((1.0 - auVar119._0_4_ * fVar110) * fVar110 + fVar110) * (fVar112 + fVar112);
        fVar178 = ((1.0 - auVar119._4_4_ * fVar177) * fVar177 + fVar177) * (fVar178 + fVar178);
        fVar144 = ((1.0 - auVar119._8_4_ * fVar144) * fVar144 + fVar144) * (fVar148 + fVar148);
        fVar124 = ((1.0 - auVar119._12_4_ * fVar124) * fVar124 + fVar124) * (fVar125 + fVar125);
        fVar177 = *(float *)(ray + k * 4 + 0x80);
        fVar110 = *(float *)(ray + k * 4 + 0x30);
        auVar62._0_4_ = -(uint)(fVar112 <= fVar177 && fVar110 <= fVar112) & auVar129._0_4_;
        auVar62._4_4_ = -(uint)(fVar178 <= fVar177 && fVar110 <= fVar178) & auVar129._4_4_;
        auVar62._8_4_ = -(uint)(fVar144 <= fVar177 && fVar110 <= fVar144) & auVar129._8_4_;
        auVar62._12_4_ = -(uint)(fVar124 <= fVar177 && fVar110 <= fVar124) & auVar129._12_4_;
        iVar21 = movmskps(iVar21,auVar62);
        if (iVar21 != 0) {
          auVar120._4_4_ = -(uint)(auVar119._4_4_ != 0.0);
          auVar120._0_4_ = -(uint)(auVar119._0_4_ != 0.0);
          auVar120._8_4_ = -(uint)(auVar119._8_4_ != 0.0);
          auVar120._12_4_ = -(uint)(auVar119._12_4_ != 0.0);
          valid.field_0.i[0] = auVar62._0_4_ & -(uint)(auVar119._0_4_ != 0.0);
          valid.field_0.i[1] = auVar62._4_4_ & -(uint)(auVar119._4_4_ != 0.0);
          valid.field_0.i[2] = auVar62._8_4_ & -(uint)(auVar119._8_4_ != 0.0);
          valid.field_0.i[3] = auVar62._12_4_ & -(uint)(auVar119._12_4_ != 0.0);
          iVar21 = movmskps(iVar21,(undefined1  [16])valid.field_0);
          if (iVar21 != 0) {
            uVar33 = pGVar26->_geomID;
            uVar34 = pGVar26->_primID;
            uStack_12c0 = auVar152._8_8_;
            tNear.field_0._8_8_ = uStack_12c0;
            tNear.field_0._0_8_ = auVar152._0_8_;
            local_1128[0] = fVar112;
            local_1128[1] = fVar178;
            local_1128[2] = fVar144;
            local_1128[3] = fVar124;
            pGVar8 = (context->scene->geometries).items[uVar33].ptr;
            if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              uVar35 = *(uint *)(pGVar26->data + lVar14);
              pcVar3 = local_1220 + uVar23 * 4;
              uVar36 = *(uint *)pcVar3;
              uVar37 = *(uint *)(pcVar3 + 4);
              uVar38 = *(uint *)(pGVar26->data + lVar14 + 4);
              uVar39 = *(uint *)(pcVar3 + 8);
              if (uVar23 == 2) {
                uVar38 = uVar35;
                uVar39 = uVar37;
              }
              auVar46 = rcpps(auVar120,auVar10);
              fVar110 = auVar46._0_4_;
              fVar148 = auVar46._4_4_;
              fVar125 = auVar46._8_4_;
              fVar113 = auVar46._12_4_;
              fVar154 = (float)(-(uint)(1e-18 <= local_fa8) &
                               (uint)(((float)DAT_01f46a60 - fVar154 * fVar110) * fVar110 + fVar110)
                               );
              fVar206 = (float)(-(uint)(1e-18 <= fStack_fa4) &
                               (uint)((DAT_01f46a60._4_4_ - fVar206 * fVar148) * fVar148 + fVar148))
              ;
              fVar157 = (float)(-(uint)(1e-18 <= fStack_fa0) &
                               (uint)((DAT_01f46a60._8_4_ - fVar157 * fVar125) * fVar125 + fVar125))
              ;
              fVar207 = (float)(-(uint)(1e-18 <= fStack_f9c) &
                               (uint)((DAT_01f46a60._12_4_ - fVar207 * fVar113) * fVar113 + fVar113)
                               );
              auVar184._0_4_ = fVar151 * fVar154;
              auVar184._4_4_ = fVar155 * fVar206;
              auVar184._8_4_ = auVar152._8_4_ * fVar157;
              auVar184._12_4_ = auVar152._12_4_ * fVar207;
              auVar172 = minps(auVar184,_DAT_01f46a60);
              auVar82._0_4_ = auVar102._0_4_ * fVar154;
              auVar82._4_4_ = auVar102._4_4_ * fVar206;
              auVar82._8_4_ = auVar102._8_4_ * fVar157;
              auVar82._12_4_ = auVar102._12_4_ * fVar207;
              auVar46 = minps(auVar82,_DAT_01f46a60);
              fVar57 = auVar172._0_4_;
              fVar56 = auVar172._4_4_;
              fVar188 = auVar172._8_4_;
              fVar76 = auVar172._12_4_;
              fVar154 = auVar46._0_4_;
              fVar206 = auVar46._4_4_;
              fVar157 = auVar46._8_4_;
              fVar207 = auVar46._12_4_;
              fVar110 = ((float)DAT_01f46a60 - fVar57) - fVar154;
              fVar148 = (DAT_01f46a60._4_4_ - fVar56) - fVar206;
              fVar125 = (DAT_01f46a60._8_4_ - fVar188) - fVar157;
              fVar113 = (DAT_01f46a60._12_4_ - fVar76) - fVar207;
              local_1148[0] =
                   (float)(*(uint *)local_1220 & 0xffff) * 0.00012207031 * fVar110 +
                   (float)(uVar36 & 0xffff) * 0.00012207031 * fVar154 +
                   (float)(uVar35 & 0xffff) * 0.00012207031 * fVar57;
              local_1148[1] =
                   (float)(uVar36 & 0xffff) * 0.00012207031 * fVar148 +
                   (float)(uVar37 & 0xffff) * 0.00012207031 * fVar206 +
                   (float)(uVar35 & 0xffff) * 0.00012207031 * fVar56;
              local_1148[2] =
                   (float)(uVar35 & 0xffff) * 0.00012207031 * fVar125 +
                   (float)(uVar37 & 0xffff) * 0.00012207031 * fVar157 +
                   (float)(uVar38 & 0xffff) * 0.00012207031 * fVar188;
              local_1148[3] =
                   (float)(uVar37 & 0xffff) * 0.00012207031 * fVar113 +
                   (float)(uVar39 & 0xffff) * 0.00012207031 * fVar207 +
                   (float)(uVar38 & 0xffff) * 0.00012207031 * fVar76;
              local_1138[0] =
                   fVar110 * (float)(*(uint *)local_1220 >> 0x10) * 0.00012207031 +
                   (float)(uVar36 >> 0x10) * 0.00012207031 * fVar154 +
                   (float)(uVar35 >> 0x10) * 0.00012207031 * fVar57;
              local_1138[1] =
                   fVar148 * (float)(uVar36 >> 0x10) * 0.00012207031 +
                   (float)(uVar37 >> 0x10) * 0.00012207031 * fVar206 +
                   (float)(uVar35 >> 0x10) * 0.00012207031 * fVar56;
              local_1138[2] =
                   fVar125 * (float)(uVar35 >> 0x10) * 0.00012207031 +
                   (float)(uVar37 >> 0x10) * 0.00012207031 * fVar157 +
                   (float)(uVar38 >> 0x10) * 0.00012207031 * fVar188;
              local_1138[3] =
                   fVar113 * (float)(uVar37 >> 0x10) * 0.00012207031 +
                   (float)(uVar39 >> 0x10) * 0.00012207031 * fVar207 +
                   (float)(uVar38 >> 0x10) * 0.00012207031 * fVar76;
              auVar47._0_4_ = (uint)fVar112 & valid.field_0.i[0];
              auVar47._4_4_ = (uint)fVar178 & valid.field_0.i[1];
              auVar47._8_4_ = (uint)fVar144 & valid.field_0.i[2];
              auVar47._12_4_ = (uint)fVar124 & valid.field_0.i[3];
              auVar83._0_8_ = CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000
              ;
              auVar83._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
              auVar83._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
              auVar83 = auVar83 | auVar47;
              auVar103._4_4_ = auVar83._0_4_;
              auVar103._0_4_ = auVar83._4_4_;
              auVar103._8_4_ = auVar83._12_4_;
              auVar103._12_4_ = auVar83._8_4_;
              auVar46 = minps(auVar103,auVar83);
              auVar48._0_8_ = auVar46._8_8_;
              auVar48._8_4_ = auVar46._0_4_;
              auVar48._12_4_ = auVar46._4_4_;
              auVar46 = minps(auVar48,auVar46);
              uVar39 = -(uint)(auVar46._0_4_ == auVar83._0_4_);
              uVar40 = -(uint)(auVar46._4_4_ == auVar83._4_4_);
              uVar41 = -(uint)(auVar46._8_4_ == auVar83._8_4_);
              uVar42 = -(uint)(auVar46._12_4_ == auVar83._12_4_);
              auVar84._0_4_ = uVar39 & valid.field_0.i[0];
              auVar84._4_4_ = uVar40 & valid.field_0.i[1];
              auVar84._8_4_ = uVar41 & valid.field_0.i[2];
              auVar84._12_4_ = uVar42 & valid.field_0.i[3];
              iVar21 = movmskps((int)local_1220,auVar84);
              uVar35 = 0xffffffff;
              uVar36 = 0xffffffff;
              uVar37 = 0xffffffff;
              uVar38 = 0xffffffff;
              if (iVar21 != 0) {
                uVar35 = uVar39;
                uVar36 = uVar40;
                uVar37 = uVar41;
                uVar38 = uVar42;
              }
              auVar63._0_4_ = valid.field_0.i[0] & uVar35;
              auVar63._4_4_ = valid.field_0.i[1] & uVar36;
              auVar63._8_4_ = valid.field_0.i[2] & uVar37;
              auVar63._12_4_ = valid.field_0.i[3] & uVar38;
              uVar27 = movmskps(iVar21,auVar63);
              uVar19 = CONCAT44((int)((ulong)local_1220 >> 0x20),uVar27);
              lVar25 = 0;
              if (uVar19 != 0) {
                for (; (uVar19 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
                }
              }
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar154 = local_1148[lVar25];
                fVar206 = local_1138[lVar25];
                fVar157 = local_1108[lVar25 + -4];
                fVar207 = local_1108[lVar25];
                fVar110 = local_10f8[lVar25];
                *(float *)(ray + k * 4 + 0x80) = local_1128[lVar25];
                *(float *)(ray + k * 4 + 0xc0) = fVar157;
                *(float *)(ray + k * 4 + 0xd0) = fVar207;
                *(float *)(ray + k * 4 + 0xe0) = fVar110;
                *(float *)(ray + k * 4 + 0xf0) = fVar154;
                *(float *)(ray + k * 4 + 0x100) = fVar206;
                *(uint *)(ray + k * 4 + 0x110) = uVar34;
                *(uint *)(ray + k * 4 + 0x120) = uVar33;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                local_1268 = CONCAT44(uVar34,uVar34);
                auVar12 = *(undefined1 (*) [12])(mm_lookupmask_ps + lVar16);
                uStack_11ac = (undefined4)
                              ((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar16 + 8) >> 0x20);
                local_1218 = uVar23;
                local_1210 = (ulong)uVar15;
                local_1208 = fVar112;
                fStack_1204 = fVar178;
                fStack_1200 = fVar144;
                fStack_11fc = fVar124;
                local_11f8 = uVar23;
                while( true ) {
                  local_1078 = local_1148[lVar25];
                  fVar154 = local_1138[lVar25];
                  *(float *)(ray + k * 4 + 0x80) = local_1128[lVar25];
                  args.context = context->user;
                  local_1068._4_4_ = fVar154;
                  local_1068._0_4_ = fVar154;
                  local_1068._8_4_ = fVar154;
                  local_1068._12_4_ = fVar154;
                  local_10a8 = local_1108[lVar25 + -4];
                  fVar154 = local_1108[lVar25];
                  local_1088 = local_10f8[lVar25];
                  local_1098._4_4_ = fVar154;
                  local_1098._0_4_ = fVar154;
                  local_1098._8_4_ = fVar154;
                  local_1098._12_4_ = fVar154;
                  fStack_10a4 = local_10a8;
                  fStack_10a0 = local_10a8;
                  fStack_109c = local_10a8;
                  fStack_1084 = local_1088;
                  fStack_1080 = local_1088;
                  fStack_107c = local_1088;
                  fStack_1074 = local_1078;
                  fStack_1070 = local_1078;
                  fStack_106c = local_1078;
                  local_1058 = local_1268;
                  uStack_1050 = CONCAT44(uVar34,uVar34);
                  local_1048 = CONCAT44(uVar33,uVar33);
                  uStack_1040 = CONCAT44(uVar33,uVar33);
                  local_1038 = (args.context)->instID[0];
                  uStack_1034 = local_1038;
                  uStack_1030 = local_1038;
                  uStack_102c = local_1038;
                  local_1028 = (args.context)->instPrimID[0];
                  uStack_1024 = local_1028;
                  uStack_1020 = local_1028;
                  uStack_101c = local_1028;
                  local_1238._12_4_ = uStack_11ac;
                  local_1238._0_12_ = auVar12;
                  args.valid = (int *)local_1238;
                  args.geometryUserPtr = pGVar8->userPtr;
                  args.hit = (RTCHitN *)&local_10a8;
                  args.N = 4;
                  p_Var20 = pGVar8->intersectionFilterN;
                  args.ray = (RTCRayN *)ray;
                  if (p_Var20 != (RTCFilterFunctionN)0x0) {
                    p_Var20 = (RTCFilterFunctionN)(*p_Var20)(&args);
                    uVar23 = local_11f8;
                    fVar112 = local_1208;
                    fVar178 = fStack_1204;
                    fVar144 = fStack_1200;
                    fVar124 = fStack_11fc;
                  }
                  auVar66._0_4_ = -(uint)(local_1238._0_4_ == 0);
                  auVar66._4_4_ = -(uint)(local_1238._4_4_ == 0);
                  auVar66._8_4_ = -(uint)(local_1238._8_4_ == 0);
                  auVar66._12_4_ = -(uint)(local_1238._12_4_ == 0);
                  uVar35 = movmskps((int)p_Var20,auVar66);
                  pRVar18 = (RTCRayN *)(ulong)(uVar35 ^ 0xf);
                  if ((uVar35 ^ 0xf) == 0) {
                    auVar66 = auVar66 ^ _DAT_01f46b70;
                  }
                  else {
                    p_Var20 = context->args->filter;
                    if ((p_Var20 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      p_Var20 = (RTCFilterFunctionN)(*p_Var20)(&args);
                      uVar23 = local_11f8;
                      fVar112 = local_1208;
                      fVar178 = fStack_1204;
                      fVar144 = fStack_1200;
                      fVar124 = fStack_11fc;
                    }
                    auVar52._0_4_ = -(uint)(local_1238._0_4_ == 0);
                    auVar52._4_4_ = -(uint)(local_1238._4_4_ == 0);
                    auVar52._8_4_ = -(uint)(local_1238._8_4_ == 0);
                    auVar52._12_4_ = -(uint)(local_1238._12_4_ == 0);
                    auVar66 = auVar52 ^ _DAT_01f46b70;
                    uVar35 = movmskps((int)p_Var20,auVar52);
                    pRVar18 = (RTCRayN *)(ulong)(uVar35 ^ 0xf);
                    if ((uVar35 ^ 0xf) != 0) {
                      auVar89._0_4_ = *(uint *)(args.ray + 0xc0) & auVar52._0_4_;
                      auVar89._4_4_ = *(uint *)(args.ray + 0xc4) & auVar52._4_4_;
                      auVar89._8_4_ = *(uint *)(args.ray + 200) & auVar52._8_4_;
                      auVar89._12_4_ = *(uint *)(args.ray + 0xcc) & auVar52._12_4_;
                      auVar139._0_4_ = ~auVar52._0_4_ & *(uint *)args.hit;
                      auVar139._4_4_ = ~auVar52._4_4_ & *(uint *)(args.hit + 4);
                      auVar139._8_4_ = ~auVar52._8_4_ & *(uint *)(args.hit + 8);
                      auVar139._12_4_ = ~auVar52._12_4_ & *(uint *)(args.hit + 0xc);
                      *(undefined1 (*) [16])(args.ray + 0xc0) = auVar139 | auVar89;
                      uVar35 = *(uint *)(args.hit + 0x14);
                      uVar36 = *(uint *)(args.hit + 0x18);
                      uVar37 = *(uint *)(args.hit + 0x1c);
                      *(uint *)(args.ray + 0xd0) =
                           ~auVar52._0_4_ & *(uint *)(args.hit + 0x10) |
                           *(uint *)(args.ray + 0xd0) & auVar52._0_4_;
                      *(uint *)(args.ray + 0xd4) =
                           ~auVar52._4_4_ & uVar35 | *(uint *)(args.ray + 0xd4) & auVar52._4_4_;
                      *(uint *)(args.ray + 0xd8) =
                           ~auVar52._8_4_ & uVar36 | *(uint *)(args.ray + 0xd8) & auVar52._8_4_;
                      *(uint *)(args.ray + 0xdc) =
                           ~auVar52._12_4_ & uVar37 | *(uint *)(args.ray + 0xdc) & auVar52._12_4_;
                      uVar35 = *(uint *)(args.hit + 0x24);
                      uVar36 = *(uint *)(args.hit + 0x28);
                      uVar37 = *(uint *)(args.hit + 0x2c);
                      *(uint *)(args.ray + 0xe0) =
                           ~auVar52._0_4_ & *(uint *)(args.hit + 0x20) |
                           *(uint *)(args.ray + 0xe0) & auVar52._0_4_;
                      *(uint *)(args.ray + 0xe4) =
                           ~auVar52._4_4_ & uVar35 | *(uint *)(args.ray + 0xe4) & auVar52._4_4_;
                      *(uint *)(args.ray + 0xe8) =
                           ~auVar52._8_4_ & uVar36 | *(uint *)(args.ray + 0xe8) & auVar52._8_4_;
                      *(uint *)(args.ray + 0xec) =
                           ~auVar52._12_4_ & uVar37 | *(uint *)(args.ray + 0xec) & auVar52._12_4_;
                      auVar132._0_4_ = *(uint *)(args.ray + 0xf0) & auVar52._0_4_;
                      auVar132._4_4_ = *(uint *)(args.ray + 0xf4) & auVar52._4_4_;
                      auVar132._8_4_ = *(uint *)(args.ray + 0xf8) & auVar52._8_4_;
                      auVar132._12_4_ = *(uint *)(args.ray + 0xfc) & auVar52._12_4_;
                      auVar90._0_4_ = ~auVar52._0_4_ & *(uint *)(args.hit + 0x30);
                      auVar90._4_4_ = ~auVar52._4_4_ & *(uint *)(args.hit + 0x34);
                      auVar90._8_4_ = ~auVar52._8_4_ & *(uint *)(args.hit + 0x38);
                      auVar90._12_4_ = ~auVar52._12_4_ & *(uint *)(args.hit + 0x3c);
                      *(undefined1 (*) [16])(args.ray + 0xf0) = auVar90 | auVar132;
                      uVar35 = *(uint *)(args.hit + 0x44);
                      uVar36 = *(uint *)(args.hit + 0x48);
                      uVar37 = *(uint *)(args.hit + 0x4c);
                      *(uint *)(args.ray + 0x100) =
                           ~auVar52._0_4_ & *(uint *)(args.hit + 0x40) |
                           *(uint *)(args.ray + 0x100) & auVar52._0_4_;
                      *(uint *)(args.ray + 0x104) =
                           ~auVar52._4_4_ & uVar35 | *(uint *)(args.ray + 0x104) & auVar52._4_4_;
                      *(uint *)(args.ray + 0x108) =
                           ~auVar52._8_4_ & uVar36 | *(uint *)(args.ray + 0x108) & auVar52._8_4_;
                      *(uint *)(args.ray + 0x10c) =
                           ~auVar52._12_4_ & uVar37 | *(uint *)(args.ray + 0x10c) & auVar52._12_4_;
                      uVar35 = *(uint *)(args.hit + 0x54);
                      uVar36 = *(uint *)(args.hit + 0x58);
                      uVar37 = *(uint *)(args.hit + 0x5c);
                      *(uint *)(args.ray + 0x110) =
                           *(uint *)(args.ray + 0x110) & auVar52._0_4_ |
                           ~auVar52._0_4_ & *(uint *)(args.hit + 0x50);
                      *(uint *)(args.ray + 0x114) =
                           *(uint *)(args.ray + 0x114) & auVar52._4_4_ | ~auVar52._4_4_ & uVar35;
                      *(uint *)(args.ray + 0x118) =
                           *(uint *)(args.ray + 0x118) & auVar52._8_4_ | ~auVar52._8_4_ & uVar36;
                      *(uint *)(args.ray + 0x11c) =
                           *(uint *)(args.ray + 0x11c) & auVar52._12_4_ | ~auVar52._12_4_ & uVar37;
                      uVar35 = *(uint *)(args.hit + 100);
                      uVar36 = *(uint *)(args.hit + 0x68);
                      uVar37 = *(uint *)(args.hit + 0x6c);
                      *(uint *)(args.ray + 0x120) =
                           *(uint *)(args.ray + 0x120) & auVar52._0_4_ |
                           ~auVar52._0_4_ & *(uint *)(args.hit + 0x60);
                      *(uint *)(args.ray + 0x124) =
                           *(uint *)(args.ray + 0x124) & auVar52._4_4_ | ~auVar52._4_4_ & uVar35;
                      *(uint *)(args.ray + 0x128) =
                           *(uint *)(args.ray + 0x128) & auVar52._8_4_ | ~auVar52._8_4_ & uVar36;
                      *(uint *)(args.ray + 300) =
                           *(uint *)(args.ray + 300) & auVar52._12_4_ | ~auVar52._12_4_ & uVar37;
                      auVar91._0_4_ = *(uint *)(args.ray + 0x130) & auVar52._0_4_;
                      auVar91._4_4_ = *(uint *)(args.ray + 0x134) & auVar52._4_4_;
                      auVar91._8_4_ = *(uint *)(args.ray + 0x138) & auVar52._8_4_;
                      auVar91._12_4_ = *(uint *)(args.ray + 0x13c) & auVar52._12_4_;
                      auVar106._0_4_ = ~auVar52._0_4_ & *(uint *)(args.hit + 0x70);
                      auVar106._4_4_ = ~auVar52._4_4_ & *(uint *)(args.hit + 0x74);
                      auVar106._8_4_ = ~auVar52._8_4_ & *(uint *)(args.hit + 0x78);
                      auVar106._12_4_ = ~auVar52._12_4_ & *(uint *)(args.hit + 0x7c);
                      *(undefined1 (*) [16])(args.ray + 0x130) = auVar106 | auVar91;
                      *(undefined1 (*) [16])(args.ray + 0x140) =
                           ~auVar52 & *(undefined1 (*) [16])(args.hit + 0x80) |
                           *(undefined1 (*) [16])(args.ray + 0x140) & auVar52;
                      pRVar18 = args.ray;
                    }
                  }
                  auVar67._0_4_ = auVar66._0_4_ << 0x1f;
                  auVar67._4_4_ = auVar66._4_4_ << 0x1f;
                  auVar67._8_4_ = auVar66._8_4_ << 0x1f;
                  auVar67._12_4_ = auVar66._12_4_ << 0x1f;
                  iVar21 = movmskps((int)pRVar18,auVar67);
                  if (iVar21 == 0) {
                    *(float *)(ray + k * 4 + 0x80) = fVar177;
                  }
                  else {
                    fVar177 = *(float *)(ray + k * 4 + 0x80);
                  }
                  *(undefined4 *)(local_1238 + lVar25 * 4 + -0x10) = 0;
                  valid.field_0.i[0] = -(uint)(fVar112 <= fVar177) & valid.field_0.i[0];
                  valid.field_0.i[1] = -(uint)(fVar178 <= fVar177) & valid.field_0.i[1];
                  valid.field_0.i[2] = -(uint)(fVar144 <= fVar177) & valid.field_0.i[2];
                  valid.field_0.i[3] = -(uint)(fVar124 <= fVar177) & valid.field_0.i[3];
                  iVar21 = movmskps((int)lVar25,(undefined1  [16])valid.field_0);
                  if (iVar21 == 0) break;
                  auVar68._0_4_ = valid.field_0.i[0] & (uint)fVar112;
                  auVar68._4_4_ = valid.field_0.i[1] & (uint)fVar178;
                  auVar68._8_4_ = valid.field_0.i[2] & (uint)fVar144;
                  auVar68._12_4_ = valid.field_0.i[3] & (uint)fVar124;
                  auVar92._0_8_ =
                       CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                  auVar92._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                  auVar92._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                  auVar92 = auVar92 | auVar68;
                  auVar107._4_4_ = auVar92._0_4_;
                  auVar107._0_4_ = auVar92._4_4_;
                  auVar107._8_4_ = auVar92._12_4_;
                  auVar107._12_4_ = auVar92._8_4_;
                  auVar46 = minps(auVar107,auVar92);
                  auVar69._0_8_ = auVar46._8_8_;
                  auVar69._8_4_ = auVar46._0_4_;
                  auVar69._12_4_ = auVar46._4_4_;
                  auVar46 = minps(auVar69,auVar46);
                  auVar70._0_8_ =
                       CONCAT44(-(uint)(auVar46._4_4_ == auVar92._4_4_) & valid.field_0.i[1],
                                -(uint)(auVar46._0_4_ == auVar92._0_4_) & valid.field_0.i[0]);
                  auVar70._8_4_ = -(uint)(auVar46._8_4_ == auVar92._8_4_) & valid.field_0.i[2];
                  auVar70._12_4_ = -(uint)(auVar46._12_4_ == auVar92._12_4_) & valid.field_0.i[3];
                  iVar21 = movmskps(iVar21,auVar70);
                  aVar53 = valid.field_0;
                  if (iVar21 != 0) {
                    aVar53.i[2] = auVar70._8_4_;
                    aVar53._0_8_ = auVar70._0_8_;
                    aVar53.i[3] = auVar70._12_4_;
                  }
                  uVar27 = movmskps(iVar21,(undefined1  [16])aVar53);
                  uVar19 = CONCAT44((int)((ulong)lVar25 >> 0x20),uVar27);
                  lVar25 = 0;
                  if (uVar19 != 0) {
                    for (; (uVar19 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
                    }
                  }
                }
              }
            }
          }
        }
      }
      if (2 < uVar15) {
        lVar30 = uVar23 * 4 + lVar30;
        pcVar24 = pGVar26->data + lVar30 + -4;
        fVar154 = *(float *)(pGVar26->data + lVar30);
        pcVar3 = pcVar24 + uVar23 * 4;
        fVar206 = *(float *)(pcVar3 + 4);
        fVar157 = *(float *)(pGVar26->data + lVar30 + 4);
        fVar207 = *(float *)(pcVar3 + 8);
        if (uVar23 == 2) {
          fVar157 = fVar154;
          fVar207 = fVar206;
        }
        pGVar26 = (local_1228->super_Precalculations).grid;
        uVar19 = (ulong)pGVar26->dim_offset;
        pcVar1 = pcVar24 + uVar19 * 4;
        fVar110 = *(float *)(pcVar1 + 4);
        pcVar2 = pcVar1 + uVar23 * 4;
        fVar177 = *(float *)(pcVar2 + 4);
        fVar112 = *(float *)(pcVar1 + 8);
        fVar178 = *(float *)(pcVar2 + 8);
        if (uVar23 == 2) {
          fVar112 = fVar110;
          fVar178 = fVar177;
        }
        pcVar4 = pcVar24 + uVar19 * 8;
        fVar144 = *(float *)(pcVar4 + 4);
        pcVar5 = pcVar4 + uVar23 * 4;
        fVar124 = *(float *)(pcVar5 + 4);
        fVar148 = *(float *)(pcVar4 + 8);
        fVar125 = *(float *)(pcVar5 + 8);
        if (uVar23 == 2) {
          fVar148 = fVar144;
          fVar125 = fVar124;
        }
        local_1220 = pcVar24 + uVar19 * 0xc;
        fVar113 = *(float *)(ray + k * 4);
        fVar57 = *(float *)(ray + k * 4 + 0x10);
        fVar56 = *(float *)(ray + k * 4 + 0x20);
        fVar188 = *(float *)(ray + k * 4 + 0x40);
        fVar163 = *(float *)pcVar24 - fVar113;
        fVar166 = *(float *)pcVar3 - fVar113;
        fVar169 = fVar154 - fVar113;
        fVar179 = fVar206 - fVar113;
        local_1208 = *(float *)pcVar1 - fVar57;
        fStack_1204 = *(float *)pcVar2 - fVar57;
        fStack_1200 = fVar110 - fVar57;
        fStack_11fc = fVar177 - fVar57;
        fVar146 = *(float *)pcVar4 - fVar56;
        fVar147 = *(float *)pcVar5 - fVar56;
        fVar149 = fVar144 - fVar56;
        fVar150 = fVar124 - fVar56;
        fVar159 = fVar154 - fVar113;
        fVar154 = fVar154 - fVar113;
        fVar162 = fVar157 - fVar113;
        fVar157 = fVar157 - fVar113;
        fVar123 = fVar110 - fVar57;
        fVar110 = fVar110 - fVar57;
        fVar134 = fVar112 - fVar57;
        fVar112 = fVar112 - fVar57;
        fVar143 = fVar144 - fVar56;
        fVar144 = fVar144 - fVar56;
        fVar145 = fVar148 - fVar56;
        fVar148 = fVar148 - fVar56;
        fVar202 = *(float *)pcVar3 - fVar113;
        fVar205 = fVar206 - fVar113;
        fVar206 = fVar206 - fVar113;
        fVar207 = fVar207 - fVar113;
        fVar182 = *(float *)pcVar2 - fVar57;
        fVar183 = fVar177 - fVar57;
        fVar177 = fVar177 - fVar57;
        fVar178 = fVar178 - fVar57;
        fVar141 = *(float *)pcVar5 - fVar56;
        fVar142 = fVar124 - fVar56;
        fVar124 = fVar124 - fVar56;
        fVar125 = fVar125 - fVar56;
        fVar164 = fVar202 - fVar163;
        fVar167 = fVar205 - fVar166;
        fVar170 = fVar206 - fVar169;
        fVar180 = fVar207 - fVar179;
        fVar191 = fVar182 - local_1208;
        fVar193 = fVar183 - fStack_1204;
        fVar196 = fVar177 - fStack_1200;
        fVar199 = fVar178 - fStack_11fc;
        fVar151 = fVar141 - fVar146;
        fVar155 = fVar142 - fVar147;
        fVar156 = fVar124 - fVar149;
        fVar158 = fVar125 - fVar150;
        fStack_11f0 = *(float *)(ray + k * 4 + 0x50);
        fVar113 = *(float *)(ray + k * 4 + 0x60);
        fVar165 = fVar163 - fVar159;
        fVar168 = fVar166 - fVar154;
        fVar176 = fVar169 - fVar162;
        fVar181 = fVar179 - fVar157;
        fVar160 = (fVar191 * (fVar141 + fVar146) - (fVar182 + local_1208) * fVar151) * fVar188 +
                  ((fVar202 + fVar163) * fVar151 - (fVar141 + fVar146) * fVar164) * fStack_11f0 +
                  (fVar164 * (fVar182 + local_1208) - (fVar202 + fVar163) * fVar191) * fVar113;
        fVar161 = (fVar193 * (fVar142 + fVar147) - (fVar183 + fStack_1204) * fVar155) * fVar188 +
                  ((fVar205 + fVar166) * fVar155 - (fVar142 + fVar147) * fVar167) * fStack_11f0 +
                  (fVar167 * (fVar183 + fStack_1204) - (fVar205 + fVar166) * fVar193) * fVar113;
        auVar153._0_8_ = CONCAT44(fVar161,fVar160);
        auVar153._8_4_ =
             (fVar196 * (fVar124 + fVar149) - (fVar177 + fStack_1200) * fVar156) * fVar188 +
             ((fVar206 + fVar169) * fVar156 - (fVar124 + fVar149) * fVar170) * fStack_11f0 +
             (fVar170 * (fVar177 + fStack_1200) - (fVar206 + fVar169) * fVar196) * fVar113;
        auVar153._12_4_ =
             (fVar199 * (fVar125 + fVar150) - (fVar178 + fStack_11fc) * fVar158) * fVar188 +
             ((fVar207 + fVar179) * fVar158 - (fVar125 + fVar150) * fVar180) * fStack_11f0 +
             (fVar180 * (fVar178 + fStack_11fc) - (fVar207 + fVar179) * fVar199) * fVar113;
        fVar78 = local_1208 - fVar123;
        fVar97 = fStack_1204 - fVar110;
        fVar111 = fStack_1200 - fVar134;
        fVar114 = fStack_11fc - fVar112;
        fVar186 = fVar146 - fVar143;
        fVar187 = fVar147 - fVar144;
        fVar189 = fVar149 - fVar145;
        fVar190 = fVar150 - fVar148;
        auVar104._0_4_ =
             (fVar78 * (fVar146 + fVar143) - (local_1208 + fVar123) * fVar186) * fVar188 +
             ((fVar163 + fVar159) * fVar186 - (fVar146 + fVar143) * fVar165) * fStack_11f0 +
             (fVar165 * (local_1208 + fVar123) - (fVar163 + fVar159) * fVar78) * fVar113;
        auVar104._4_4_ =
             (fVar97 * (fVar147 + fVar144) - (fStack_1204 + fVar110) * fVar187) * fVar188 +
             ((fVar166 + fVar154) * fVar187 - (fVar147 + fVar144) * fVar168) * fStack_11f0 +
             (fVar168 * (fStack_1204 + fVar110) - (fVar166 + fVar154) * fVar97) * fVar113;
        auVar104._8_4_ =
             (fVar111 * (fVar149 + fVar145) - (fStack_1200 + fVar134) * fVar189) * fVar188 +
             ((fVar169 + fVar162) * fVar189 - (fVar149 + fVar145) * fVar176) * fStack_11f0 +
             (fVar176 * (fStack_1200 + fVar134) - (fVar169 + fVar162) * fVar111) * fVar113;
        auVar104._12_4_ =
             (fVar114 * (fVar150 + fVar148) - (fStack_11fc + fVar112) * fVar190) * fVar188 +
             ((fVar179 + fVar157) * fVar190 - (fVar150 + fVar148) * fVar181) * fStack_11f0 +
             (fVar181 * (fStack_11fc + fVar112) - (fVar179 + fVar157) * fVar114) * fVar113;
        fVar57 = fVar159 - fVar202;
        fVar56 = fVar154 - fVar205;
        fVar76 = fVar162 - fVar206;
        fVar77 = fVar157 - fVar207;
        fVar192 = fVar123 - fVar182;
        fVar195 = fVar110 - fVar183;
        fVar198 = fVar134 - fVar177;
        fVar201 = fVar112 - fVar178;
        fVar204 = fVar143 - fVar141;
        fVar194 = fVar144 - fVar142;
        fVar197 = fVar145 - fVar124;
        fVar200 = fVar148 - fVar125;
        local_11f8 = CONCAT44(fStack_11f0,fStack_11f0);
        auVar138._0_4_ =
             (fVar192 * (fVar141 + fVar143) - (fVar182 + fVar123) * fVar204) * fVar188 +
             ((fVar202 + fVar159) * fVar204 - (fVar141 + fVar143) * fVar57) * fStack_11f0 +
             (fVar57 * (fVar182 + fVar123) - (fVar202 + fVar159) * fVar192) * fVar113;
        auVar138._4_4_ =
             (fVar195 * (fVar142 + fVar144) - (fVar183 + fVar110) * fVar194) * fVar188 +
             ((fVar205 + fVar154) * fVar194 - (fVar142 + fVar144) * fVar56) * fStack_11f0 +
             (fVar56 * (fVar183 + fVar110) - (fVar205 + fVar154) * fVar195) * fVar113;
        auVar138._8_4_ =
             (fVar198 * (fVar124 + fVar145) - (fVar177 + fVar134) * fVar197) * fVar188 +
             ((fVar206 + fVar162) * fVar197 - (fVar124 + fVar145) * fVar76) * fStack_11f0 +
             (fVar76 * (fVar177 + fVar134) - (fVar206 + fVar162) * fVar198) * fVar113;
        auVar138._12_4_ =
             (fVar201 * (fVar125 + fVar148) - (fVar178 + fVar112) * fVar200) * fVar188 +
             ((fVar207 + fVar157) * fVar200 - (fVar125 + fVar148) * fVar77) * fStack_11f0 +
             (fVar77 * (fVar178 + fVar112) - (fVar207 + fVar157) * fVar201) * fVar113;
        fVar154 = fVar160 + auVar104._0_4_ + auVar138._0_4_;
        fVar206 = fVar161 + auVar104._4_4_ + auVar138._4_4_;
        fVar157 = auVar153._8_4_ + auVar104._8_4_ + auVar138._8_4_;
        fVar207 = auVar153._12_4_ + auVar104._12_4_ + auVar138._12_4_;
        auVar174._8_4_ = auVar153._8_4_;
        auVar174._0_8_ = auVar153._0_8_;
        auVar174._12_4_ = auVar153._12_4_;
        auVar46 = minps(auVar174,auVar104);
        auVar172 = minps(auVar46,auVar138);
        auVar130._8_4_ = auVar153._8_4_;
        auVar130._0_8_ = auVar153._0_8_;
        auVar130._12_4_ = auVar153._12_4_;
        auVar46 = maxps(auVar130,auVar104);
        auVar46 = maxps(auVar46,auVar138);
        local_10d8 = ABS(fVar154);
        fStack_10d4 = ABS(fVar206);
        fStack_10d0 = ABS(fVar157);
        fStack_10cc = ABS(fVar207);
        auVar131._4_4_ = -(uint)(auVar46._4_4_ <= fStack_10d4 * 1.1920929e-07);
        auVar131._0_4_ = -(uint)(auVar46._0_4_ <= local_10d8 * 1.1920929e-07);
        auVar131._8_4_ = -(uint)(auVar46._8_4_ <= fStack_10d0 * 1.1920929e-07);
        auVar131._12_4_ = -(uint)(auVar46._12_4_ <= fStack_10cc * 1.1920929e-07);
        auVar175._4_4_ = -(uint)(-(fStack_10d4 * 1.1920929e-07) <= auVar172._4_4_);
        auVar175._0_4_ = -(uint)(-(local_10d8 * 1.1920929e-07) <= auVar172._0_4_);
        auVar175._8_4_ = -(uint)(-(fStack_10d0 * 1.1920929e-07) <= auVar172._8_4_);
        auVar175._12_4_ = -(uint)(-(fStack_10cc * 1.1920929e-07) <= auVar172._12_4_);
        auVar131 = auVar131 | auVar175;
        iVar21 = movmskps(uVar15,auVar131);
        if (iVar21 != 0) {
          uVar33 = -(uint)(ABS(fVar192 * fVar186) <= ABS(fVar78 * fVar151));
          uVar36 = -(uint)(ABS(fVar195 * fVar187) <= ABS(fVar97 * fVar155));
          uVar39 = -(uint)(ABS(fVar198 * fVar189) <= ABS(fVar111 * fVar156));
          uVar42 = -(uint)(ABS(fVar201 * fVar190) <= ABS(fVar114 * fVar158));
          uVar34 = -(uint)(ABS(fVar165 * fVar204) <= ABS(fVar164 * fVar186));
          uVar37 = -(uint)(ABS(fVar168 * fVar194) <= ABS(fVar167 * fVar187));
          uVar40 = -(uint)(ABS(fVar176 * fVar197) <= ABS(fVar170 * fVar189));
          uVar43 = -(uint)(ABS(fVar181 * fVar200) <= ABS(fVar180 * fVar190));
          uVar35 = -(uint)(ABS(fVar57 * fVar78) <= ABS(fVar165 * fVar191));
          uVar38 = -(uint)(ABS(fVar56 * fVar97) <= ABS(fVar168 * fVar193));
          uVar41 = -(uint)(ABS(fVar76 * fVar111) <= ABS(fVar176 * fVar196));
          uVar44 = -(uint)(ABS(fVar77 * fVar114) <= ABS(fVar181 * fVar199));
          auVar85._0_4_ = (uint)(fVar78 * fVar204 - fVar192 * fVar186) & uVar33;
          auVar85._4_4_ = (uint)(fVar97 * fVar194 - fVar195 * fVar187) & uVar36;
          auVar85._8_4_ = (uint)(fVar111 * fVar197 - fVar198 * fVar189) & uVar39;
          auVar85._12_4_ = (uint)(fVar114 * fVar200 - fVar201 * fVar190) & uVar42;
          auVar203._0_4_ = ~uVar33 & (uint)(fVar191 * fVar186 - fVar78 * fVar151);
          auVar203._4_4_ = ~uVar36 & (uint)(fVar193 * fVar187 - fVar97 * fVar155);
          auVar203._8_4_ = ~uVar39 & (uint)(fVar196 * fVar189 - fVar111 * fVar156);
          auVar203._12_4_ = ~uVar42 & (uint)(fVar199 * fVar190 - fVar114 * fVar158);
          auVar11._4_4_ = fVar206;
          auVar11._0_4_ = fVar154;
          auVar11._8_4_ = fVar157;
          auVar11._12_4_ = fVar207;
          _local_1118 = auVar203 | auVar85;
          local_1108[0] =
               (float)(~uVar34 & (uint)(fVar151 * fVar165 - fVar164 * fVar186) |
                      (uint)(fVar57 * fVar186 - fVar165 * fVar204) & uVar34);
          local_1108[1] =
               (float)(~uVar37 & (uint)(fVar155 * fVar168 - fVar167 * fVar187) |
                      (uint)(fVar56 * fVar187 - fVar168 * fVar194) & uVar37);
          local_1108[2] =
               (float)(~uVar40 & (uint)(fVar156 * fVar176 - fVar170 * fVar189) |
                      (uint)(fVar76 * fVar189 - fVar176 * fVar197) & uVar40);
          local_1108[3] =
               (float)(~uVar43 & (uint)(fVar158 * fVar181 - fVar180 * fVar190) |
                      (uint)(fVar77 * fVar190 - fVar181 * fVar200) & uVar43);
          local_10f8[0] =
               (float)(~uVar35 & (uint)(fVar164 * fVar78 - fVar165 * fVar191) |
                      (uint)(fVar165 * fVar192 - fVar57 * fVar78) & uVar35);
          local_10f8[1] =
               (float)(~uVar38 & (uint)(fVar167 * fVar97 - fVar168 * fVar193) |
                      (uint)(fVar168 * fVar195 - fVar56 * fVar97) & uVar38);
          local_10f8[2] =
               (float)(~uVar41 & (uint)(fVar170 * fVar111 - fVar176 * fVar196) |
                      (uint)(fVar176 * fVar198 - fVar76 * fVar111) & uVar41);
          local_10f8[3] =
               (float)(~uVar44 & (uint)(fVar180 * fVar114 - fVar181 * fVar199) |
                      (uint)(fVar181 * fVar201 - fVar77 * fVar114) & uVar44);
          fVar110 = fVar188 * local_1118._0_4_ +
                    fStack_11f0 * local_1108[0] + fVar113 * local_10f8[0];
          fVar177 = fVar188 * local_1118._4_4_ +
                    fStack_11f0 * local_1108[1] + fVar113 * local_10f8[1];
          fVar112 = fVar188 * local_1118._8_4_ +
                    fStack_11f0 * local_1108[2] + fVar113 * local_10f8[2];
          fVar178 = fVar188 * local_1118._12_4_ +
                    fStack_11f0 * local_1108[3] + fVar113 * local_10f8[3];
          auVar121._0_4_ = fVar110 + fVar110;
          auVar121._4_4_ = fVar177 + fVar177;
          auVar121._8_4_ = fVar112 + fVar112;
          auVar121._12_4_ = fVar178 + fVar178;
          auVar49._0_4_ = fVar146 * local_10f8[0];
          auVar49._4_4_ = fVar147 * local_10f8[1];
          auVar49._8_4_ = fVar149 * local_10f8[2];
          auVar49._12_4_ = fVar150 * local_10f8[3];
          fVar144 = fVar163 * local_1118._0_4_ + local_1208 * local_1108[0] + auVar49._0_4_;
          fVar124 = fVar166 * local_1118._4_4_ + fStack_1204 * local_1108[1] + auVar49._4_4_;
          fVar148 = fVar169 * local_1118._8_4_ + fStack_1200 * local_1108[2] + auVar49._8_4_;
          fVar125 = fVar179 * local_1118._12_4_ + fStack_11fc * local_1108[3] + auVar49._12_4_;
          auVar46 = rcpps(auVar49,auVar121);
          fVar110 = auVar46._0_4_;
          fVar177 = auVar46._4_4_;
          fVar112 = auVar46._8_4_;
          fVar178 = auVar46._12_4_;
          fVar144 = ((1.0 - auVar121._0_4_ * fVar110) * fVar110 + fVar110) * (fVar144 + fVar144);
          fVar124 = ((1.0 - auVar121._4_4_ * fVar177) * fVar177 + fVar177) * (fVar124 + fVar124);
          fVar112 = ((1.0 - auVar121._8_4_ * fVar112) * fVar112 + fVar112) * (fVar148 + fVar148);
          fVar178 = ((1.0 - auVar121._12_4_ * fVar178) * fVar178 + fVar178) * (fVar125 + fVar125);
          fVar177 = *(float *)(ray + k * 4 + 0x80);
          fVar110 = *(float *)(ray + k * 4 + 0x30);
          auVar64._0_4_ = -(uint)(fVar144 <= fVar177 && fVar110 <= fVar144) & auVar131._0_4_;
          auVar64._4_4_ = -(uint)(fVar124 <= fVar177 && fVar110 <= fVar124) & auVar131._4_4_;
          auVar64._8_4_ = -(uint)(fVar112 <= fVar177 && fVar110 <= fVar112) & auVar131._8_4_;
          auVar64._12_4_ = -(uint)(fVar178 <= fVar177 && fVar110 <= fVar178) & auVar131._12_4_;
          iVar21 = movmskps(iVar21,auVar64);
          if (iVar21 != 0) {
            auVar122._4_4_ = -(uint)(auVar121._4_4_ != 0.0);
            auVar122._0_4_ = -(uint)(auVar121._0_4_ != 0.0);
            auVar122._8_4_ = -(uint)(auVar121._8_4_ != 0.0);
            auVar122._12_4_ = -(uint)(auVar121._12_4_ != 0.0);
            valid.field_0.i[0] = auVar64._0_4_ & -(uint)(auVar121._0_4_ != 0.0);
            valid.field_0.i[1] = auVar64._4_4_ & -(uint)(auVar121._4_4_ != 0.0);
            valid.field_0.i[2] = auVar64._8_4_ & -(uint)(auVar121._8_4_ != 0.0);
            valid.field_0.i[3] = auVar64._12_4_ & -(uint)(auVar121._12_4_ != 0.0);
            iVar21 = movmskps(iVar21,(undefined1  [16])valid.field_0);
            if (iVar21 != 0) {
              uVar33 = pGVar26->_geomID;
              uVar34 = pGVar26->_primID;
              uStack_12b0 = auVar153._8_8_;
              tNear.field_0._8_8_ = uStack_12b0;
              tNear.field_0._0_8_ = auVar153._0_8_;
              local_1128[0] = fVar144;
              local_1128[1] = fVar124;
              local_1128[2] = fVar112;
              local_1128[3] = fVar178;
              pGVar8 = (context->scene->geometries).items[uVar33].ptr;
              if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                uVar35 = *(uint *)(local_1220 + 4);
                pcVar3 = local_1220 + uVar23 * 4;
                uVar36 = *(uint *)pcVar3;
                uVar37 = *(uint *)(pcVar3 + 4);
                uVar38 = *(uint *)(local_1220 + 8);
                uVar39 = *(uint *)(pcVar3 + 8);
                if (uVar23 == 2) {
                  uVar38 = uVar35;
                  uVar39 = uVar37;
                }
                auVar46 = rcpps(auVar122,auVar11);
                fVar110 = auVar46._0_4_;
                fVar148 = auVar46._4_4_;
                fVar125 = auVar46._8_4_;
                fVar113 = auVar46._12_4_;
                fVar154 = (float)(-(uint)(1e-18 <= local_10d8) &
                                 (uint)(((float)DAT_01f46a60 - fVar154 * fVar110) * fVar110 +
                                       fVar110));
                fVar206 = (float)(-(uint)(1e-18 <= fStack_10d4) &
                                 (uint)((DAT_01f46a60._4_4_ - fVar206 * fVar148) * fVar148 + fVar148
                                       ));
                fVar157 = (float)(-(uint)(1e-18 <= fStack_10d0) &
                                 (uint)((DAT_01f46a60._8_4_ - fVar157 * fVar125) * fVar125 + fVar125
                                       ));
                fVar207 = (float)(-(uint)(1e-18 <= fStack_10cc) &
                                 (uint)((DAT_01f46a60._12_4_ - fVar207 * fVar113) * fVar113 +
                                       fVar113));
                auVar185._0_4_ = fVar160 * fVar154;
                auVar185._4_4_ = fVar161 * fVar206;
                auVar185._8_4_ = auVar153._8_4_ * fVar157;
                auVar185._12_4_ = auVar153._12_4_ * fVar207;
                auVar172 = minps(auVar185,_DAT_01f46a60);
                auVar86._0_4_ = auVar104._0_4_ * fVar154;
                auVar86._4_4_ = auVar104._4_4_ * fVar206;
                auVar86._8_4_ = auVar104._8_4_ * fVar157;
                auVar86._12_4_ = auVar104._12_4_ * fVar207;
                auVar46 = minps(auVar86,_DAT_01f46a60);
                fVar57 = auVar172._0_4_;
                fVar56 = auVar172._4_4_;
                fVar188 = auVar172._8_4_;
                fVar76 = auVar172._12_4_;
                fVar154 = auVar46._0_4_;
                fVar206 = auVar46._4_4_;
                fVar157 = auVar46._8_4_;
                fVar207 = auVar46._12_4_;
                fVar110 = ((float)DAT_01f46a60 - fVar57) - fVar154;
                fVar148 = (DAT_01f46a60._4_4_ - fVar56) - fVar206;
                fVar125 = (DAT_01f46a60._8_4_ - fVar188) - fVar157;
                fVar113 = (DAT_01f46a60._12_4_ - fVar76) - fVar207;
                local_1148[0] =
                     (float)(*(uint *)local_1220 & 0xffff) * 0.00012207031 * fVar110 +
                     (float)(uVar36 & 0xffff) * 0.00012207031 * fVar154 +
                     (float)(uVar35 & 0xffff) * 0.00012207031 * fVar57;
                local_1148[1] =
                     (float)(uVar36 & 0xffff) * 0.00012207031 * fVar148 +
                     (float)(uVar37 & 0xffff) * 0.00012207031 * fVar206 +
                     (float)(uVar35 & 0xffff) * 0.00012207031 * fVar56;
                local_1148[2] =
                     (float)(uVar35 & 0xffff) * 0.00012207031 * fVar125 +
                     (float)(uVar37 & 0xffff) * 0.00012207031 * fVar157 +
                     (float)(uVar38 & 0xffff) * 0.00012207031 * fVar188;
                local_1148[3] =
                     (float)(uVar37 & 0xffff) * 0.00012207031 * fVar113 +
                     (float)(uVar39 & 0xffff) * 0.00012207031 * fVar207 +
                     (float)(uVar38 & 0xffff) * 0.00012207031 * fVar76;
                local_1138[0] =
                     fVar110 * (float)(*(uint *)local_1220 >> 0x10) * 0.00012207031 +
                     (float)(uVar36 >> 0x10) * 0.00012207031 * fVar154 +
                     (float)(uVar35 >> 0x10) * 0.00012207031 * fVar57;
                local_1138[1] =
                     fVar148 * (float)(uVar36 >> 0x10) * 0.00012207031 +
                     (float)(uVar37 >> 0x10) * 0.00012207031 * fVar206 +
                     (float)(uVar35 >> 0x10) * 0.00012207031 * fVar56;
                local_1138[2] =
                     fVar125 * (float)(uVar35 >> 0x10) * 0.00012207031 +
                     (float)(uVar37 >> 0x10) * 0.00012207031 * fVar157 +
                     (float)(uVar38 >> 0x10) * 0.00012207031 * fVar188;
                local_1138[3] =
                     fVar113 * (float)(uVar37 >> 0x10) * 0.00012207031 +
                     (float)(uVar39 >> 0x10) * 0.00012207031 * fVar207 +
                     (float)(uVar38 >> 0x10) * 0.00012207031 * fVar76;
                auVar50._0_4_ = (uint)fVar144 & valid.field_0.i[0];
                auVar50._4_4_ = (uint)fVar124 & valid.field_0.i[1];
                auVar50._8_4_ = (uint)fVar112 & valid.field_0.i[2];
                auVar50._12_4_ = (uint)fVar178 & valid.field_0.i[3];
                auVar87._0_8_ =
                     CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                auVar87._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                auVar87._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                auVar87 = auVar87 | auVar50;
                auVar105._4_4_ = auVar87._0_4_;
                auVar105._0_4_ = auVar87._4_4_;
                auVar105._8_4_ = auVar87._12_4_;
                auVar105._12_4_ = auVar87._8_4_;
                auVar46 = minps(auVar105,auVar87);
                auVar51._0_8_ = auVar46._8_8_;
                auVar51._8_4_ = auVar46._0_4_;
                auVar51._12_4_ = auVar46._4_4_;
                auVar46 = minps(auVar51,auVar46);
                uVar39 = -(uint)(auVar46._0_4_ == auVar87._0_4_);
                uVar40 = -(uint)(auVar46._4_4_ == auVar87._4_4_);
                uVar41 = -(uint)(auVar46._8_4_ == auVar87._8_4_);
                uVar42 = -(uint)(auVar46._12_4_ == auVar87._12_4_);
                auVar88._0_4_ = uVar39 & valid.field_0.i[0];
                auVar88._4_4_ = uVar40 & valid.field_0.i[1];
                auVar88._8_4_ = uVar41 & valid.field_0.i[2];
                auVar88._12_4_ = uVar42 & valid.field_0.i[3];
                iVar21 = movmskps((int)local_1220,auVar88);
                uVar35 = 0xffffffff;
                uVar36 = 0xffffffff;
                uVar37 = 0xffffffff;
                uVar38 = 0xffffffff;
                if (iVar21 != 0) {
                  uVar35 = uVar39;
                  uVar36 = uVar40;
                  uVar37 = uVar41;
                  uVar38 = uVar42;
                }
                auVar65._0_4_ = valid.field_0.i[0] & uVar35;
                auVar65._4_4_ = valid.field_0.i[1] & uVar36;
                auVar65._8_4_ = valid.field_0.i[2] & uVar37;
                auVar65._12_4_ = valid.field_0.i[3] & uVar38;
                uVar27 = movmskps(iVar21,auVar65);
                uVar19 = CONCAT44((int)((ulong)local_1220 >> 0x20),uVar27);
                lVar30 = 0;
                if (uVar19 != 0) {
                  for (; (uVar19 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                  }
                }
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar154 = local_1148[lVar30];
                  fVar206 = local_1138[lVar30];
                  fVar157 = local_1108[lVar30 + -4];
                  fVar207 = local_1108[lVar30];
                  fVar110 = local_10f8[lVar30];
                  *(float *)(ray + k * 4 + 0x80) = local_1128[lVar30];
                  *(float *)(ray + k * 4 + 0xc0) = fVar157;
                  *(float *)(ray + k * 4 + 0xd0) = fVar207;
                  *(float *)(ray + k * 4 + 0xe0) = fVar110;
                  *(float *)(ray + k * 4 + 0xf0) = fVar154;
                  *(float *)(ray + k * 4 + 0x100) = fVar206;
                  *(uint *)(ray + k * 4 + 0x110) = uVar34;
                  *(uint *)(ray + k * 4 + 0x120) = uVar33;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
                else {
                  local_1258 = CONCAT44(uVar33,uVar33);
                  local_1298 = CONCAT44(uVar34,uVar34);
                  auVar12 = *(undefined1 (*) [12])(mm_lookupmask_ps + lVar16);
                  uStack_127c = (undefined4)
                                ((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar16 + 8) >> 0x20);
                  local_1218 = uVar23;
                  local_1210 = (ulong)uVar15;
                  fStack_11ec = fStack_11f0;
                  while( true ) {
                    local_1078 = local_1148[lVar30];
                    fVar154 = local_1138[lVar30];
                    *(float *)(ray + k * 4 + 0x80) = local_1128[lVar30];
                    args.context = context->user;
                    local_1068._4_4_ = fVar154;
                    local_1068._0_4_ = fVar154;
                    local_1068._8_4_ = fVar154;
                    local_1068._12_4_ = fVar154;
                    local_10a8 = local_1108[lVar30 + -4];
                    fVar154 = local_1108[lVar30];
                    local_1088 = local_10f8[lVar30];
                    local_1098._4_4_ = fVar154;
                    local_1098._0_4_ = fVar154;
                    local_1098._8_4_ = fVar154;
                    local_1098._12_4_ = fVar154;
                    fStack_10a4 = local_10a8;
                    fStack_10a0 = local_10a8;
                    fStack_109c = local_10a8;
                    fStack_1084 = local_1088;
                    fStack_1080 = local_1088;
                    fStack_107c = local_1088;
                    fStack_1074 = local_1078;
                    fStack_1070 = local_1078;
                    fStack_106c = local_1078;
                    local_1058 = local_1298;
                    uStack_1050 = CONCAT44(uVar34,uVar34);
                    local_1048 = local_1258;
                    uStack_1040 = CONCAT44(uVar33,uVar33);
                    local_1038 = (args.context)->instID[0];
                    uStack_1034 = local_1038;
                    uStack_1030 = local_1038;
                    uStack_102c = local_1038;
                    local_1028 = (args.context)->instPrimID[0];
                    uStack_1024 = local_1028;
                    uStack_1020 = local_1028;
                    uStack_101c = local_1028;
                    local_1238._12_4_ = uStack_127c;
                    local_1238._0_12_ = auVar12;
                    args.valid = (int *)local_1238;
                    args.geometryUserPtr = pGVar8->userPtr;
                    args.hit = (RTCHitN *)&local_10a8;
                    args.N = 4;
                    p_Var20 = pGVar8->intersectionFilterN;
                    args.ray = (RTCRayN *)ray;
                    if (p_Var20 != (RTCFilterFunctionN)0x0) {
                      p_Var20 = (RTCFilterFunctionN)(*p_Var20)(&args);
                    }
                    auVar71._0_4_ = -(uint)(local_1238._0_4_ == 0);
                    auVar71._4_4_ = -(uint)(local_1238._4_4_ == 0);
                    auVar71._8_4_ = -(uint)(local_1238._8_4_ == 0);
                    auVar71._12_4_ = -(uint)(local_1238._12_4_ == 0);
                    uVar15 = movmskps((int)p_Var20,auVar71);
                    pRVar18 = (RTCRayN *)(ulong)(uVar15 ^ 0xf);
                    if ((uVar15 ^ 0xf) == 0) {
                      auVar71 = auVar71 ^ _DAT_01f46b70;
                    }
                    else {
                      p_Var20 = context->args->filter;
                      if ((p_Var20 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                        p_Var20 = (RTCFilterFunctionN)(*p_Var20)(&args);
                      }
                      auVar54._0_4_ = -(uint)(local_1238._0_4_ == 0);
                      auVar54._4_4_ = -(uint)(local_1238._4_4_ == 0);
                      auVar54._8_4_ = -(uint)(local_1238._8_4_ == 0);
                      auVar54._12_4_ = -(uint)(local_1238._12_4_ == 0);
                      auVar71 = auVar54 ^ _DAT_01f46b70;
                      uVar15 = movmskps((int)p_Var20,auVar54);
                      pRVar18 = (RTCRayN *)(ulong)(uVar15 ^ 0xf);
                      if ((uVar15 ^ 0xf) != 0) {
                        auVar93._0_4_ = *(uint *)(args.ray + 0xc0) & auVar54._0_4_;
                        auVar93._4_4_ = *(uint *)(args.ray + 0xc4) & auVar54._4_4_;
                        auVar93._8_4_ = *(uint *)(args.ray + 200) & auVar54._8_4_;
                        auVar93._12_4_ = *(uint *)(args.ray + 0xcc) & auVar54._12_4_;
                        auVar140._0_4_ = ~auVar54._0_4_ & *(uint *)args.hit;
                        auVar140._4_4_ = ~auVar54._4_4_ & *(uint *)(args.hit + 4);
                        auVar140._8_4_ = ~auVar54._8_4_ & *(uint *)(args.hit + 8);
                        auVar140._12_4_ = ~auVar54._12_4_ & *(uint *)(args.hit + 0xc);
                        *(undefined1 (*) [16])(args.ray + 0xc0) = auVar140 | auVar93;
                        uVar15 = *(uint *)(args.hit + 0x14);
                        uVar35 = *(uint *)(args.hit + 0x18);
                        uVar36 = *(uint *)(args.hit + 0x1c);
                        *(uint *)(args.ray + 0xd0) =
                             ~auVar54._0_4_ & *(uint *)(args.hit + 0x10) |
                             *(uint *)(args.ray + 0xd0) & auVar54._0_4_;
                        *(uint *)(args.ray + 0xd4) =
                             ~auVar54._4_4_ & uVar15 | *(uint *)(args.ray + 0xd4) & auVar54._4_4_;
                        *(uint *)(args.ray + 0xd8) =
                             ~auVar54._8_4_ & uVar35 | *(uint *)(args.ray + 0xd8) & auVar54._8_4_;
                        *(uint *)(args.ray + 0xdc) =
                             ~auVar54._12_4_ & uVar36 | *(uint *)(args.ray + 0xdc) & auVar54._12_4_;
                        uVar15 = *(uint *)(args.hit + 0x24);
                        uVar35 = *(uint *)(args.hit + 0x28);
                        uVar36 = *(uint *)(args.hit + 0x2c);
                        *(uint *)(args.ray + 0xe0) =
                             ~auVar54._0_4_ & *(uint *)(args.hit + 0x20) |
                             *(uint *)(args.ray + 0xe0) & auVar54._0_4_;
                        *(uint *)(args.ray + 0xe4) =
                             ~auVar54._4_4_ & uVar15 | *(uint *)(args.ray + 0xe4) & auVar54._4_4_;
                        *(uint *)(args.ray + 0xe8) =
                             ~auVar54._8_4_ & uVar35 | *(uint *)(args.ray + 0xe8) & auVar54._8_4_;
                        *(uint *)(args.ray + 0xec) =
                             ~auVar54._12_4_ & uVar36 | *(uint *)(args.ray + 0xec) & auVar54._12_4_;
                        auVar133._0_4_ = *(uint *)(args.ray + 0xf0) & auVar54._0_4_;
                        auVar133._4_4_ = *(uint *)(args.ray + 0xf4) & auVar54._4_4_;
                        auVar133._8_4_ = *(uint *)(args.ray + 0xf8) & auVar54._8_4_;
                        auVar133._12_4_ = *(uint *)(args.ray + 0xfc) & auVar54._12_4_;
                        auVar94._0_4_ = ~auVar54._0_4_ & *(uint *)(args.hit + 0x30);
                        auVar94._4_4_ = ~auVar54._4_4_ & *(uint *)(args.hit + 0x34);
                        auVar94._8_4_ = ~auVar54._8_4_ & *(uint *)(args.hit + 0x38);
                        auVar94._12_4_ = ~auVar54._12_4_ & *(uint *)(args.hit + 0x3c);
                        *(undefined1 (*) [16])(args.ray + 0xf0) = auVar94 | auVar133;
                        uVar15 = *(uint *)(args.hit + 0x44);
                        uVar35 = *(uint *)(args.hit + 0x48);
                        uVar36 = *(uint *)(args.hit + 0x4c);
                        *(uint *)(args.ray + 0x100) =
                             ~auVar54._0_4_ & *(uint *)(args.hit + 0x40) |
                             *(uint *)(args.ray + 0x100) & auVar54._0_4_;
                        *(uint *)(args.ray + 0x104) =
                             ~auVar54._4_4_ & uVar15 | *(uint *)(args.ray + 0x104) & auVar54._4_4_;
                        *(uint *)(args.ray + 0x108) =
                             ~auVar54._8_4_ & uVar35 | *(uint *)(args.ray + 0x108) & auVar54._8_4_;
                        *(uint *)(args.ray + 0x10c) =
                             ~auVar54._12_4_ & uVar36 | *(uint *)(args.ray + 0x10c) & auVar54._12_4_
                        ;
                        uVar15 = *(uint *)(args.hit + 0x54);
                        uVar35 = *(uint *)(args.hit + 0x58);
                        uVar36 = *(uint *)(args.hit + 0x5c);
                        *(uint *)(args.ray + 0x110) =
                             *(uint *)(args.ray + 0x110) & auVar54._0_4_ |
                             ~auVar54._0_4_ & *(uint *)(args.hit + 0x50);
                        *(uint *)(args.ray + 0x114) =
                             *(uint *)(args.ray + 0x114) & auVar54._4_4_ | ~auVar54._4_4_ & uVar15;
                        *(uint *)(args.ray + 0x118) =
                             *(uint *)(args.ray + 0x118) & auVar54._8_4_ | ~auVar54._8_4_ & uVar35;
                        *(uint *)(args.ray + 0x11c) =
                             *(uint *)(args.ray + 0x11c) & auVar54._12_4_ | ~auVar54._12_4_ & uVar36
                        ;
                        uVar15 = *(uint *)(args.hit + 100);
                        uVar35 = *(uint *)(args.hit + 0x68);
                        uVar36 = *(uint *)(args.hit + 0x6c);
                        *(uint *)(args.ray + 0x120) =
                             *(uint *)(args.ray + 0x120) & auVar54._0_4_ |
                             ~auVar54._0_4_ & *(uint *)(args.hit + 0x60);
                        *(uint *)(args.ray + 0x124) =
                             *(uint *)(args.ray + 0x124) & auVar54._4_4_ | ~auVar54._4_4_ & uVar15;
                        *(uint *)(args.ray + 0x128) =
                             *(uint *)(args.ray + 0x128) & auVar54._8_4_ | ~auVar54._8_4_ & uVar35;
                        *(uint *)(args.ray + 300) =
                             *(uint *)(args.ray + 300) & auVar54._12_4_ | ~auVar54._12_4_ & uVar36;
                        auVar95._0_4_ = *(uint *)(args.ray + 0x130) & auVar54._0_4_;
                        auVar95._4_4_ = *(uint *)(args.ray + 0x134) & auVar54._4_4_;
                        auVar95._8_4_ = *(uint *)(args.ray + 0x138) & auVar54._8_4_;
                        auVar95._12_4_ = *(uint *)(args.ray + 0x13c) & auVar54._12_4_;
                        auVar108._0_4_ = ~auVar54._0_4_ & *(uint *)(args.hit + 0x70);
                        auVar108._4_4_ = ~auVar54._4_4_ & *(uint *)(args.hit + 0x74);
                        auVar108._8_4_ = ~auVar54._8_4_ & *(uint *)(args.hit + 0x78);
                        auVar108._12_4_ = ~auVar54._12_4_ & *(uint *)(args.hit + 0x7c);
                        *(undefined1 (*) [16])(args.ray + 0x130) = auVar108 | auVar95;
                        *(undefined1 (*) [16])(args.ray + 0x140) =
                             ~auVar54 & *(undefined1 (*) [16])(args.hit + 0x80) |
                             *(undefined1 (*) [16])(args.ray + 0x140) & auVar54;
                        pRVar18 = args.ray;
                      }
                    }
                    auVar72._0_4_ = auVar71._0_4_ << 0x1f;
                    auVar72._4_4_ = auVar71._4_4_ << 0x1f;
                    auVar72._8_4_ = auVar71._8_4_ << 0x1f;
                    auVar72._12_4_ = auVar71._12_4_ << 0x1f;
                    iVar21 = movmskps((int)pRVar18,auVar72);
                    if (iVar21 == 0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar177;
                    }
                    else {
                      fVar177 = *(float *)(ray + k * 4 + 0x80);
                    }
                    *(undefined4 *)(local_1238 + lVar30 * 4 + -0x10) = 0;
                    valid.field_0.i[0] = -(uint)(fVar144 <= fVar177) & valid.field_0.i[0];
                    valid.field_0.i[1] = -(uint)(fVar124 <= fVar177) & valid.field_0.i[1];
                    valid.field_0.i[2] = -(uint)(fVar112 <= fVar177) & valid.field_0.i[2];
                    valid.field_0.i[3] = -(uint)(fVar178 <= fVar177) & valid.field_0.i[3];
                    iVar21 = movmskps(iVar21,(undefined1  [16])valid.field_0);
                    if (iVar21 == 0) break;
                    auVar73._0_4_ = valid.field_0.i[0] & (uint)fVar144;
                    auVar73._4_4_ = valid.field_0.i[1] & (uint)fVar124;
                    auVar73._8_4_ = valid.field_0.i[2] & (uint)fVar112;
                    auVar73._12_4_ = valid.field_0.i[3] & (uint)fVar178;
                    auVar96._0_8_ =
                         CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                    auVar96._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                    auVar96._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                    auVar96 = auVar96 | auVar73;
                    auVar109._4_4_ = auVar96._0_4_;
                    auVar109._0_4_ = auVar96._4_4_;
                    auVar109._8_4_ = auVar96._12_4_;
                    auVar109._12_4_ = auVar96._8_4_;
                    auVar46 = minps(auVar109,auVar96);
                    auVar74._0_8_ = auVar46._8_8_;
                    auVar74._8_4_ = auVar46._0_4_;
                    auVar74._12_4_ = auVar46._4_4_;
                    auVar46 = minps(auVar74,auVar46);
                    auVar75._0_8_ =
                         CONCAT44(-(uint)(auVar46._4_4_ == auVar96._4_4_) & valid.field_0.i[1],
                                  -(uint)(auVar46._0_4_ == auVar96._0_4_) & valid.field_0.i[0]);
                    auVar75._8_4_ = -(uint)(auVar46._8_4_ == auVar96._8_4_) & valid.field_0.i[2];
                    auVar75._12_4_ = -(uint)(auVar46._12_4_ == auVar96._12_4_) & valid.field_0.i[3];
                    iVar21 = movmskps(iVar21,auVar75);
                    aVar55 = valid.field_0;
                    if (iVar21 != 0) {
                      aVar55.i[2] = auVar75._8_4_;
                      aVar55._0_8_ = auVar75._0_8_;
                      aVar55.i[3] = auVar75._12_4_;
                    }
                    uVar27 = movmskps(iVar21,(undefined1  [16])aVar55);
                    uVar23 = CONCAT44((int)((ulong)pRVar18 >> 0x20),uVar27);
                    lVar30 = 0;
                    if (uVar23 != 0) {
                      for (; (uVar23 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      uVar27 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar172._4_4_ = uVar27;
      auVar172._0_4_ = uVar27;
      auVar172._8_4_ = uVar27;
      auVar172._12_4_ = uVar27;
      auVar46 = local_10e8;
      fVar154 = local_fb8;
      fVar206 = fStack_fb4;
      fVar157 = fStack_fb0;
      fVar207 = fStack_fac;
      fVar110 = local_fc8;
      fVar177 = fStack_fc4;
      fVar112 = fStack_fc0;
      fVar178 = fStack_fbc;
      fVar144 = local_fe8;
      fVar124 = fStack_fe4;
      fVar148 = fStack_fe0;
      fVar125 = fStack_fdc;
      fVar113 = local_10c8;
      fVar57 = fStack_10c4;
      fVar56 = fStack_10c0;
      fVar188 = fStack_10bc;
      fVar76 = local_10b8;
      fVar77 = fStack_10b4;
      fVar78 = fStack_10b0;
      fVar97 = fStack_10ac;
      fVar111 = local_fd8;
      fVar114 = fStack_fd4;
      fVar123 = fStack_fd0;
      fVar134 = fStack_fcc;
      fVar141 = local_ff8;
      fVar142 = fStack_ff4;
      fVar143 = fStack_ff0;
      fVar145 = fStack_fec;
      fVar146 = local_1008;
      fVar147 = fStack_1004;
      fVar149 = fStack_1000;
      fVar150 = fStack_ffc;
      fVar151 = local_1018;
      fVar155 = fStack_1014;
      fVar156 = fStack_1010;
      fVar158 = fStack_100c;
    }
    else {
      pGVar26 = (GridSOA *)((ulong)pSVar22 & 0xfffffffffffffff0);
      sVar9 = *(size_t *)(pGVar26->data + pGVar26->rootOffset);
      (local_1228->super_Precalculations).grid = pGVar26;
      uVar27 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar172._4_4_ = uVar27;
      auVar172._0_4_ = uVar27;
      auVar172._8_4_ = uVar27;
      auVar172._12_4_ = uVar27;
      if (sVar9 != 0) {
        (pSVar29->ptr).ptr = sVar9;
        pSVar29->dist = 0;
        pSVar29 = pSVar29 + 1;
      }
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }